

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O2

Result __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::aggregateVars(SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *lp,
               SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *row,int *i)

{
  int *piVar1;
  shared_ptr<soplex::Tolerances> *psVar2;
  uint *puVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  int iVar6;
  uint uVar7;
  int32_t iVar8;
  int iVar9;
  int32_t iVar10;
  int iVar11;
  pointer pnVar12;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar13;
  pointer pnVar14;
  DataKey *pDVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  undefined8 uVar38;
  undefined8 uVar39;
  undefined8 uVar40;
  undefined8 uVar41;
  undefined8 uVar42;
  bool bVar43;
  undefined8 uVar44;
  bool bVar45;
  bool bVar46;
  type_conflict5 tVar47;
  uint uVar48;
  double *pdVar49;
  AggregationPS *this_00;
  SPxInternalCodeException *pSVar50;
  fpclass_type fVar51;
  cpp_dec_float<50U,_int,_void> *pcVar52;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *extraout_RDX;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *extraout_RDX_00;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *extraout_RDX_01;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *extraout_RDX_02;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar53;
  cpp_dec_float<50U,_int,_void> *v;
  int r;
  long lVar54;
  Item *pIVar55;
  multiprecision *this_01;
  Item *pIVar56;
  long lVar57;
  Real RVar58;
  uint local_1004;
  uint local_1000;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<50U,_int,_void> local_fa8;
  long local_f70;
  Item *local_f68;
  Item *local_f60;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_f58;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_f18;
  cpp_dec_float<50U,_int,_void> local_ed8;
  cpp_dec_float<50U,_int,_void> local_e98;
  cpp_dec_float<50U,_int,_void> local_e58;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_35;
  cpp_dec_float<50U,_int,_void> local_dd8;
  cpp_dec_float<50U,_int,_void> local_d98;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  aggr_const;
  cpp_dec_float<50U,_int,_void> local_d18;
  long local_cd8;
  undefined8 uStack_cd0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  z2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  obj_j;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_c48;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_c08;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  scale1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  z1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_34;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  scale2;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_ac8;
  shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
  ptr;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a78;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a38;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_9f8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_9b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_978;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_938;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_8f8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_8b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_878;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_838;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_7f8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_7b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_778;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_738;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_6f8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_6b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_678;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_638;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_5f8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_5b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_578;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_32;
  soplex local_4f8 [8];
  uint auStack_4f0 [2];
  uint local_4e8 [2];
  uint auStack_4e0 [2];
  uint local_4d8 [2];
  int local_4d0;
  undefined1 local_4cc;
  fpclass_type local_4c8;
  int32_t iStack_4c4;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_31;
  soplex local_478 [8];
  uint auStack_470 [2];
  uint local_468 [2];
  uint auStack_460 [2];
  uint local_458 [2];
  int local_450;
  undefined1 local_44c;
  fpclass_type local_448;
  int32_t iStack_444;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_28;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3f8;
  multiprecision local_3b8 [44];
  multiprecision amStack_38c [20];
  uint local_378 [2];
  uint auStack_370 [2];
  uint local_368 [2];
  uint auStack_360 [2];
  uint local_358 [2];
  int local_350;
  multiprecision local_34c;
  fpclass_type local_348;
  int32_t iStack_344;
  multiprecision local_338 [64];
  multiprecision local_2f8 [8];
  uint auStack_2f0 [2];
  uint local_2e8 [2];
  uint auStack_2e0 [2];
  uint local_2d8 [2];
  int local_2d0;
  multiprecision local_2cc;
  fpclass_type local_2c8;
  int32_t iStack_2c4;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_278;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_238;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1f8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_180;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_148;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_110;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  iVar6 = *i;
  pnVar12 = (lp->
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).right.val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_d18.data._M_elems._32_8_ = *(undefined8 *)(pnVar12[iVar6].m_backend.data._M_elems + 8);
  local_d18.data._M_elems._0_8_ = *(undefined8 *)&pnVar12[iVar6].m_backend.data;
  local_d18.data._M_elems._8_8_ = *(undefined8 *)(pnVar12[iVar6].m_backend.data._M_elems + 2);
  puVar3 = pnVar12[iVar6].m_backend.data._M_elems + 4;
  local_d18.data._M_elems._16_8_ = *(undefined8 *)puVar3;
  local_d18.data._M_elems._24_8_ = *(undefined8 *)(puVar3 + 2);
  local_d18.exp = pnVar12[iVar6].m_backend.exp;
  local_d18.neg = pnVar12[iVar6].m_backend.neg;
  local_d18.fpclass = pnVar12[iVar6].m_backend.fpclass;
  local_d18.prec_elem = pnVar12[iVar6].m_backend.prec_elem;
  pNVar13 = row->m_elem;
  uVar7 = pNVar13->idx;
  local_1000 = pNVar13[1].idx;
  local_e58.data._M_elems._32_8_ = *(undefined8 *)((pNVar13->val).m_backend.data._M_elems + 8);
  local_e58.data._M_elems._0_8_ = *(undefined8 *)(pNVar13->val).m_backend.data._M_elems;
  local_e58.data._M_elems._8_8_ = *(undefined8 *)((pNVar13->val).m_backend.data._M_elems + 2);
  local_e58.data._M_elems._16_8_ = *(undefined8 *)((pNVar13->val).m_backend.data._M_elems + 4);
  local_e58.data._M_elems._24_8_ = *(undefined8 *)((pNVar13->val).m_backend.data._M_elems + 6);
  local_e58.exp = (pNVar13->val).m_backend.exp;
  local_e58.neg = (pNVar13->val).m_backend.neg;
  local_e58.fpclass = (pNVar13->val).m_backend.fpclass;
  local_e58.prec_elem = (pNVar13->val).m_backend.prec_elem;
  local_e98.data._M_elems._32_8_ = *(undefined8 *)(pNVar13[1].val.m_backend.data._M_elems + 8);
  local_e98.data._M_elems._0_8_ = *(undefined8 *)pNVar13[1].val.m_backend.data._M_elems;
  local_e98.data._M_elems._8_8_ = *(undefined8 *)(pNVar13[1].val.m_backend.data._M_elems + 2);
  local_e98.data._M_elems._16_8_ = *(undefined8 *)(pNVar13[1].val.m_backend.data._M_elems + 4);
  local_e98.data._M_elems._24_8_ = *(undefined8 *)(pNVar13[1].val.m_backend.data._M_elems + 6);
  local_e98.exp = pNVar13[1].val.m_backend.exp;
  local_e98.neg = pNVar13[1].val.m_backend.neg;
  local_e98.fpclass = pNVar13[1].val.m_backend.fpclass;
  local_e98.prec_elem = pNVar13[1].val.m_backend.prec_elem;
  local_cd8 = (long)(int)uVar7;
  pnVar12 = (lp->
            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).low.val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_d98.data._M_elems._32_8_ = *(undefined8 *)(pnVar12[local_cd8].m_backend.data._M_elems + 8);
  local_d98.data._M_elems._0_8_ = *(undefined8 *)&pnVar12[local_cd8].m_backend.data;
  local_d98.data._M_elems._8_8_ = *(undefined8 *)(pnVar12[local_cd8].m_backend.data._M_elems + 2);
  puVar3 = pnVar12[local_cd8].m_backend.data._M_elems + 4;
  local_d98.data._M_elems._16_8_ = *(undefined8 *)puVar3;
  local_d98.data._M_elems._24_8_ = *(undefined8 *)(puVar3 + 2);
  local_d98.exp = pnVar12[local_cd8].m_backend.exp;
  local_d98.neg = pnVar12[local_cd8].m_backend.neg;
  local_1f8.m_backend.fpclass = pnVar12[local_cd8].m_backend.fpclass;
  local_1f8.m_backend.prec_elem = pnVar12[local_cd8].m_backend.prec_elem;
  local_d98.prec_elem = local_1f8.m_backend.prec_elem;
  local_d98.fpclass = local_1f8.m_backend.fpclass;
  pnVar14 = (lp->
            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).up.val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_dd8.data._M_elems._32_8_ = *(undefined8 *)(pnVar14[local_cd8].m_backend.data._M_elems + 8);
  local_dd8.data._M_elems._0_8_ = *(undefined8 *)&pnVar14[local_cd8].m_backend.data;
  local_dd8.data._M_elems._8_8_ = *(undefined8 *)(pnVar14[local_cd8].m_backend.data._M_elems + 2);
  puVar3 = pnVar14[local_cd8].m_backend.data._M_elems + 4;
  local_dd8.data._M_elems._16_8_ = *(undefined8 *)puVar3;
  local_dd8.data._M_elems._24_8_ = *(undefined8 *)(puVar3 + 2);
  local_dd8.exp = pnVar14[local_cd8].m_backend.exp;
  local_dd8.neg = pnVar14[local_cd8].m_backend.neg;
  local_238.m_backend.fpclass = pnVar14[local_cd8].m_backend.fpclass;
  local_238.m_backend.prec_elem = pnVar14[local_cd8].m_backend.prec_elem;
  local_dd8.prec_elem = local_238.m_backend.prec_elem;
  local_dd8.fpclass = local_238.m_backend.fpclass;
  local_f70 = (long)(int)local_1000;
  local_ed8.data._M_elems._32_8_ = *(undefined8 *)(pnVar12[local_f70].m_backend.data._M_elems + 8);
  local_ed8.data._M_elems._0_8_ = *(undefined8 *)&pnVar12[local_f70].m_backend.data;
  local_ed8.data._M_elems._8_8_ = *(undefined8 *)(pnVar12[local_f70].m_backend.data._M_elems + 2);
  puVar3 = pnVar12[local_f70].m_backend.data._M_elems + 4;
  local_ed8.data._M_elems._16_8_ = *(undefined8 *)puVar3;
  local_ed8.data._M_elems._24_8_ = *(undefined8 *)(puVar3 + 2);
  iVar6 = pnVar12[local_f70].m_backend.exp;
  local_ed8.neg = pnVar12[local_f70].m_backend.neg;
  local_f60 = (Item *)CONCAT71(local_f60._1_7_,local_ed8.neg);
  local_ed8.fpclass = pnVar12[local_f70].m_backend.fpclass;
  local_f68 = (Item *)CONCAT44(local_f68._4_4_,local_ed8.fpclass);
  iVar8 = pnVar12[local_f70].m_backend.prec_elem;
  local_ed8.prec_elem = iVar8;
  local_fa8.data._M_elems._32_8_ = *(undefined8 *)(pnVar14[local_f70].m_backend.data._M_elems + 8);
  local_fa8.data._M_elems._0_8_ = *(undefined8 *)&pnVar14[local_f70].m_backend.data;
  local_fa8.data._M_elems._8_8_ = *(undefined8 *)(pnVar14[local_f70].m_backend.data._M_elems + 2);
  puVar3 = pnVar14[local_f70].m_backend.data._M_elems + 4;
  local_fa8.data._M_elems._16_8_ = *(undefined8 *)puVar3;
  local_fa8.data._M_elems._24_8_ = *(undefined8 *)(puVar3 + 2);
  iVar9 = pnVar14[local_f70].m_backend.exp;
  bVar46 = pnVar14[local_f70].m_backend.neg;
  fVar51 = pnVar14[local_f70].m_backend.fpclass;
  iVar10 = pnVar14[local_f70].m_backend.prec_elem;
  local_fa8.prec_elem = iVar10;
  local_fa8.fpclass = fVar51;
  local_fa8.exp = iVar9;
  local_fa8.neg = bVar46;
  local_ed8.exp = iVar6;
  local_238.m_backend.data._M_elems._0_8_ = local_dd8.data._M_elems._0_8_;
  local_238.m_backend.data._M_elems._8_8_ = local_dd8.data._M_elems._8_8_;
  local_238.m_backend.data._M_elems._16_8_ = local_dd8.data._M_elems._16_8_;
  local_238.m_backend.data._M_elems._24_8_ = local_dd8.data._M_elems._24_8_;
  local_238.m_backend.data._M_elems._32_8_ = local_dd8.data._M_elems._32_8_;
  local_238.m_backend.exp = local_dd8.exp;
  local_238.m_backend.neg = local_dd8.neg;
  local_1f8.m_backend.data._M_elems._0_8_ = local_d98.data._M_elems._0_8_;
  local_1f8.m_backend.data._M_elems._8_8_ = local_d98.data._M_elems._8_8_;
  local_1f8.m_backend.data._M_elems._16_8_ = local_d98.data._M_elems._16_8_;
  local_1f8.m_backend.data._M_elems._24_8_ = local_d98.data._M_elems._24_8_;
  local_1f8.m_backend.data._M_elems._32_8_ = local_d98.data._M_elems._32_8_;
  local_1f8.m_backend.exp = local_d98.exp;
  local_1f8.m_backend.neg = local_d98.neg;
  feastol(&local_68,this);
  bVar45 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                     (&local_1f8,&local_238,&local_68);
  if (bVar45) {
    return OKAY;
  }
  local_278.m_backend.data._M_elems[8] = local_ed8.data._M_elems[8];
  local_278.m_backend.data._M_elems[9] = local_ed8.data._M_elems[9];
  local_278.m_backend.data._M_elems[4] = local_ed8.data._M_elems[4];
  local_278.m_backend.data._M_elems[5] = local_ed8.data._M_elems[5];
  local_278.m_backend.data._M_elems[6] = local_ed8.data._M_elems[6];
  local_278.m_backend.data._M_elems[7] = local_ed8.data._M_elems[7];
  local_278.m_backend.data._M_elems[0] = local_ed8.data._M_elems[0];
  local_278.m_backend.data._M_elems[1] = local_ed8.data._M_elems[1];
  local_278.m_backend.data._M_elems[2] = local_ed8.data._M_elems[2];
  local_278.m_backend.data._M_elems[3] = local_ed8.data._M_elems[3];
  local_278.m_backend.neg = (bool)local_f60._0_1_;
  local_278.m_backend.fpclass = (fpclass_type)local_f68;
  local_2b8.m_backend.data._M_elems[0] = local_fa8.data._M_elems[0];
  local_2b8.m_backend.data._M_elems[1] = local_fa8.data._M_elems[1];
  local_2b8.m_backend.data._M_elems[2] = local_fa8.data._M_elems[2];
  local_2b8.m_backend.data._M_elems[3] = local_fa8.data._M_elems[3];
  local_2b8.m_backend.data._M_elems[4] = local_fa8.data._M_elems[4];
  local_2b8.m_backend.data._M_elems[5] = local_fa8.data._M_elems[5];
  local_2b8.m_backend.data._M_elems[6] = local_fa8.data._M_elems[6];
  local_2b8.m_backend.data._M_elems[7] = local_fa8.data._M_elems[7];
  local_2b8.m_backend.data._M_elems[8] = local_fa8.data._M_elems[8];
  local_2b8.m_backend.data._M_elems[9] = local_fa8.data._M_elems[9];
  local_2b8.m_backend.exp = iVar9;
  local_2b8.m_backend.neg = bVar46;
  local_2b8.m_backend.fpclass = fVar51;
  local_2b8.m_backend.prec_elem = iVar10;
  local_278.m_backend.exp = iVar6;
  local_278.m_backend.prec_elem = iVar8;
  feastol(&local_a0,this);
  bVar46 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                     (&local_278,&local_2b8,&local_a0);
  if (bVar46) {
    return OKAY;
  }
  local_c08.m_backend.fpclass = cpp_dec_float_finite;
  local_c08.m_backend.prec_elem = 10;
  local_c08.m_backend.data._M_elems[0] = 0;
  local_c08.m_backend.data._M_elems[1] = 0;
  local_c08.m_backend.data._M_elems[2] = 0;
  local_c08.m_backend.data._M_elems[3] = 0;
  local_c08.m_backend.data._M_elems[4] = 0;
  local_c08.m_backend.data._M_elems[5] = 0;
  local_c08.m_backend.data._M_elems._24_5_ = 0;
  local_c08.m_backend.data._M_elems[7]._1_3_ = 0;
  local_c08.m_backend.data._M_elems._32_5_ = 0;
  local_c08.m_backend.data._M_elems[9]._1_3_ = 0;
  local_c08.m_backend.exp = 0;
  local_c08.m_backend.neg = false;
  local_c48.m_backend.fpclass = cpp_dec_float_finite;
  local_c48.m_backend.prec_elem = 10;
  local_c48.m_backend.data._M_elems[0] = 0;
  local_c48.m_backend.data._M_elems[1] = 0;
  local_c48.m_backend.data._M_elems[2] = 0;
  local_c48.m_backend.data._M_elems[3] = 0;
  local_c48.m_backend.data._M_elems[4] = 0;
  local_c48.m_backend.data._M_elems[5] = 0;
  local_c48.m_backend.data._M_elems._24_5_ = 0;
  local_c48.m_backend.data._M_elems[7]._1_3_ = 0;
  local_c48.m_backend.data._M_elems._32_5_ = 0;
  local_c48.m_backend.data._M_elems[9]._1_3_ = 0;
  local_c48.m_backend.exp = 0;
  local_c48.m_backend.neg = false;
  local_f18.m_backend.fpclass = cpp_dec_float_finite;
  local_f18.m_backend.prec_elem = 10;
  local_f18.m_backend.data._M_elems[0] = 0;
  local_f18.m_backend.data._M_elems[1] = 0;
  local_f18.m_backend.data._M_elems[2] = 0;
  local_f18.m_backend.data._M_elems[3] = 0;
  local_f18.m_backend.data._M_elems[4] = 0;
  local_f18.m_backend.data._M_elems[5] = 0;
  local_f18.m_backend.data._M_elems._24_5_ = 0;
  local_f18.m_backend.data._M_elems[7]._1_3_ = 0;
  local_f18.m_backend.data._M_elems._32_5_ = 0;
  local_f18.m_backend.data._M_elems[9]._1_3_ = 0;
  local_f18.m_backend.exp = 0;
  local_f18.m_backend.neg = false;
  local_f58.m_backend.fpclass = cpp_dec_float_finite;
  local_f58.m_backend.prec_elem = 10;
  local_f58.m_backend.data._M_elems[0] = 0;
  local_f58.m_backend.data._M_elems[1] = 0;
  local_f58.m_backend.data._M_elems[2] = 0;
  local_f58.m_backend.data._M_elems[3] = 0;
  local_f58.m_backend.data._M_elems[4] = 0;
  local_f58.m_backend.data._M_elems[5] = 0;
  local_f58.m_backend.data._M_elems._24_5_ = 0;
  local_f58.m_backend.data._M_elems[7]._1_3_ = 0;
  local_f58.m_backend.data._M_elems._32_5_ = 0;
  local_f58.m_backend.data._M_elems[9]._1_3_ = 0;
  local_f58.m_backend.exp = 0;
  local_f58.m_backend.neg = false;
  result.m_backend.fpclass = cpp_dec_float_finite;
  result.m_backend.prec_elem = 10;
  result.m_backend.data._M_elems[0] = 0;
  result.m_backend.data._M_elems[1] = 0;
  result.m_backend.data._M_elems[2] = 0;
  result.m_backend.data._M_elems[3] = 0;
  result.m_backend.data._M_elems[4] = 0;
  result.m_backend.data._M_elems[5] = 0;
  result.m_backend.data._M_elems._24_5_ = 0;
  result.m_backend.data._M_elems[7]._1_3_ = 0;
  result.m_backend.data._M_elems._32_5_ = 0;
  result.m_backend.data._M_elems[9]._1_3_ = 0;
  result.m_backend.exp = 0;
  result.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&result.m_backend,&local_e58,&local_e98);
  aggr_const.m_backend.data._M_elems[0] = 0;
  aggr_const.m_backend.data._M_elems[1] = 0;
  tVar47 = boost::multiprecision::operator<
                     ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)&result.m_backend,(double *)&aggr_const);
  if (tVar47) {
    pdVar49 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&aggr_const.m_backend,*pdVar49,(type *)0x0);
    tVar47 = boost::multiprecision::operator>=
                       ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&local_fa8,
                        (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&aggr_const.m_backend);
    if (tVar47) {
      pdVar49 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (&result.m_backend,-*pdVar49,(type *)0x0);
    }
    else {
      scale1.m_backend.fpclass = cpp_dec_float_finite;
      scale1.m_backend.prec_elem = 10;
      scale1.m_backend.data._M_elems[0] = 0;
      scale1.m_backend.data._M_elems[1] = 0;
      scale1.m_backend.data._M_elems[2] = 0;
      scale1.m_backend.data._M_elems[3] = 0;
      scale1.m_backend.data._M_elems[4] = 0;
      scale1.m_backend.data._M_elems[5] = 0;
      scale1.m_backend.data._M_elems._24_5_ = 0;
      scale1.m_backend.data._M_elems[7]._1_3_ = 0;
      scale1.m_backend.data._M_elems._32_5_ = 0;
      scale1.m_backend.data._M_elems[9]._1_3_ = 0;
      scale1.m_backend.exp = 0;
      scale1.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&scale1.m_backend,&local_e98,&local_fa8);
      obj_j.m_backend.fpclass = cpp_dec_float_finite;
      obj_j.m_backend.prec_elem = 10;
      obj_j.m_backend.data._M_elems[0] = 0;
      obj_j.m_backend.data._M_elems[1] = 0;
      obj_j.m_backend.data._M_elems[2] = 0;
      obj_j.m_backend.data._M_elems[3] = 0;
      obj_j.m_backend.data._M_elems[4] = 0;
      obj_j.m_backend.data._M_elems[5] = 0;
      obj_j.m_backend.data._M_elems._24_5_ = 0;
      obj_j.m_backend.data._M_elems[7]._1_3_ = 0;
      obj_j.m_backend.data._M_elems._32_5_ = 0;
      obj_j.m_backend.data._M_elems[9]._1_3_ = 0;
      obj_j.m_backend.exp = 0;
      obj_j.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&obj_j.m_backend,&local_d18,&scale1.m_backend);
      result.m_backend.fpclass = cpp_dec_float_finite;
      result.m_backend.prec_elem = 10;
      result.m_backend.data._M_elems[0] = 0;
      result.m_backend.data._M_elems[1] = 0;
      result.m_backend.data._M_elems[2] = 0;
      result.m_backend.data._M_elems[3] = 0;
      result.m_backend.data._M_elems[4] = 0;
      result.m_backend.data._M_elems[5] = 0;
      result.m_backend.data._M_elems._24_5_ = 0;
      result.m_backend.data._M_elems[7]._1_3_ = 0;
      result.m_backend.data._M_elems._32_5_ = 0;
      result.m_backend.data._M_elems[9]._1_3_ = 0;
      result.m_backend.exp = 0;
      result.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&result.m_backend,&obj_j.m_backend,&local_e58);
    }
    local_c08.m_backend.data._M_elems._32_5_ = result.m_backend.data._M_elems._32_5_;
    local_c08.m_backend.data._M_elems[9]._1_3_ = result.m_backend.data._M_elems[9]._1_3_;
    local_c08.m_backend.data._M_elems[4] = result.m_backend.data._M_elems[4];
    local_c08.m_backend.data._M_elems[5] = result.m_backend.data._M_elems[5];
    local_c08.m_backend.data._M_elems._24_5_ = result.m_backend.data._M_elems._24_5_;
    local_c08.m_backend.data._M_elems[7]._1_3_ = result.m_backend.data._M_elems[7]._1_3_;
    local_c08.m_backend.data._M_elems[0] = result.m_backend.data._M_elems[0];
    local_c08.m_backend.data._M_elems[1] = result.m_backend.data._M_elems[1];
    local_c08.m_backend.data._M_elems[2] = result.m_backend.data._M_elems[2];
    local_c08.m_backend.data._M_elems[3] = result.m_backend.data._M_elems[3];
    local_c08.m_backend.exp = result.m_backend.exp;
    local_c08.m_backend.neg = result.m_backend.neg;
    local_c08.m_backend.fpclass = result.m_backend.fpclass;
    local_c08.m_backend.prec_elem = result.m_backend.prec_elem;
    pdVar49 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&aggr_const.m_backend,-*pdVar49,(type *)0x0);
    tVar47 = boost::multiprecision::operator<=
                       ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&local_ed8,
                        (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&aggr_const.m_backend);
    if (tVar47) {
      pdVar49 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (&result.m_backend,*pdVar49,(type *)0x0);
    }
    else {
      scale1.m_backend.fpclass = cpp_dec_float_finite;
      scale1.m_backend.prec_elem = 10;
      scale1.m_backend.data._M_elems[0] = 0;
      scale1.m_backend.data._M_elems[1] = 0;
      scale1.m_backend.data._M_elems[2] = 0;
      scale1.m_backend.data._M_elems[3] = 0;
      scale1.m_backend.data._M_elems[4] = 0;
      scale1.m_backend.data._M_elems[5] = 0;
      scale1.m_backend.data._M_elems._24_5_ = 0;
      scale1.m_backend.data._M_elems[7]._1_3_ = 0;
      scale1.m_backend.data._M_elems._32_5_ = 0;
      scale1.m_backend.data._M_elems[9]._1_3_ = 0;
      scale1.m_backend.exp = 0;
      scale1.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&scale1.m_backend,&local_e98,&local_ed8);
      obj_j.m_backend.fpclass = cpp_dec_float_finite;
      obj_j.m_backend.prec_elem = 10;
      obj_j.m_backend.data._M_elems[0] = 0;
      obj_j.m_backend.data._M_elems[1] = 0;
      obj_j.m_backend.data._M_elems[2] = 0;
      obj_j.m_backend.data._M_elems[3] = 0;
      obj_j.m_backend.data._M_elems[4] = 0;
      obj_j.m_backend.data._M_elems[5] = 0;
      obj_j.m_backend.data._M_elems._24_5_ = 0;
      obj_j.m_backend.data._M_elems[7]._1_3_ = 0;
      obj_j.m_backend.data._M_elems._32_5_ = 0;
      obj_j.m_backend.data._M_elems[9]._1_3_ = 0;
      obj_j.m_backend.exp = 0;
      obj_j.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&obj_j.m_backend,&local_d18,&scale1.m_backend);
      result.m_backend.fpclass = cpp_dec_float_finite;
      result.m_backend.prec_elem = 10;
      result.m_backend.data._M_elems[0] = 0;
      result.m_backend.data._M_elems[1] = 0;
      result.m_backend.data._M_elems[2] = 0;
      result.m_backend.data._M_elems[3] = 0;
      result.m_backend.data._M_elems[4] = 0;
      result.m_backend.data._M_elems[5] = 0;
      result.m_backend.data._M_elems._24_5_ = 0;
      result.m_backend.data._M_elems[7]._1_3_ = 0;
      result.m_backend.data._M_elems._32_5_ = 0;
      result.m_backend.data._M_elems[9]._1_3_ = 0;
      result.m_backend.exp = 0;
      result.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&result.m_backend,&obj_j.m_backend,&local_e58);
    }
    local_c48.m_backend.data._M_elems._32_5_ = result.m_backend.data._M_elems._32_5_;
    local_c48.m_backend.data._M_elems[9]._1_3_ = result.m_backend.data._M_elems[9]._1_3_;
    local_c48.m_backend.data._M_elems[4] = result.m_backend.data._M_elems[4];
    local_c48.m_backend.data._M_elems[5] = result.m_backend.data._M_elems[5];
    local_c48.m_backend.data._M_elems._24_5_ = result.m_backend.data._M_elems._24_5_;
    local_c48.m_backend.data._M_elems[7]._1_3_ = result.m_backend.data._M_elems[7]._1_3_;
    local_c48.m_backend.data._M_elems[0] = result.m_backend.data._M_elems[0];
    local_c48.m_backend.data._M_elems[1] = result.m_backend.data._M_elems[1];
    local_c48.m_backend.data._M_elems[2] = result.m_backend.data._M_elems[2];
    local_c48.m_backend.data._M_elems[3] = result.m_backend.data._M_elems[3];
    local_c48.m_backend.exp = result.m_backend.exp;
    local_c48.m_backend.neg = result.m_backend.neg;
    local_c48.m_backend.fpclass = result.m_backend.fpclass;
    local_c48.m_backend.prec_elem = result.m_backend.prec_elem;
    pdVar49 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&aggr_const.m_backend,*pdVar49,(type *)0x0);
    tVar47 = boost::multiprecision::operator>=
                       ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&local_dd8,
                        (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&aggr_const.m_backend);
    if (tVar47) {
      pdVar49 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (&result.m_backend,-*pdVar49,(type *)0x0);
    }
    else {
      scale1.m_backend.fpclass = cpp_dec_float_finite;
      scale1.m_backend.prec_elem = 10;
      scale1.m_backend.data._M_elems[0] = 0;
      scale1.m_backend.data._M_elems[1] = 0;
      scale1.m_backend.data._M_elems[2] = 0;
      scale1.m_backend.data._M_elems[3] = 0;
      scale1.m_backend.data._M_elems[4] = 0;
      scale1.m_backend.data._M_elems[5] = 0;
      scale1.m_backend.data._M_elems._24_5_ = 0;
      scale1.m_backend.data._M_elems[7]._1_3_ = 0;
      scale1.m_backend.data._M_elems._32_5_ = 0;
      scale1.m_backend.data._M_elems[9]._1_3_ = 0;
      scale1.m_backend.exp = 0;
      scale1.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&scale1.m_backend,&local_e58,&local_dd8);
      obj_j.m_backend.fpclass = cpp_dec_float_finite;
      obj_j.m_backend.prec_elem = 10;
      obj_j.m_backend.data._M_elems[0] = 0;
      obj_j.m_backend.data._M_elems[1] = 0;
      obj_j.m_backend.data._M_elems[2] = 0;
      obj_j.m_backend.data._M_elems[3] = 0;
      obj_j.m_backend.data._M_elems[4] = 0;
      obj_j.m_backend.data._M_elems[5] = 0;
      obj_j.m_backend.data._M_elems._24_5_ = 0;
      obj_j.m_backend.data._M_elems[7]._1_3_ = 0;
      obj_j.m_backend.data._M_elems._32_5_ = 0;
      obj_j.m_backend.data._M_elems[9]._1_3_ = 0;
      obj_j.m_backend.exp = 0;
      obj_j.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&obj_j.m_backend,&local_d18,&scale1.m_backend);
      result.m_backend.fpclass = cpp_dec_float_finite;
      result.m_backend.prec_elem = 10;
      result.m_backend.data._M_elems[0] = 0;
      result.m_backend.data._M_elems[1] = 0;
      result.m_backend.data._M_elems[2] = 0;
      result.m_backend.data._M_elems[3] = 0;
      result.m_backend.data._M_elems[4] = 0;
      result.m_backend.data._M_elems[5] = 0;
      result.m_backend.data._M_elems._24_5_ = 0;
      result.m_backend.data._M_elems[7]._1_3_ = 0;
      result.m_backend.data._M_elems._32_5_ = 0;
      result.m_backend.data._M_elems[9]._1_3_ = 0;
      result.m_backend.exp = 0;
      result.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&result.m_backend,&obj_j.m_backend,&local_e98);
    }
    local_f18.m_backend.data._M_elems._32_5_ = result.m_backend.data._M_elems._32_5_;
    local_f18.m_backend.data._M_elems[9]._1_3_ = result.m_backend.data._M_elems[9]._1_3_;
    local_f18.m_backend.data._M_elems[4] = result.m_backend.data._M_elems[4];
    local_f18.m_backend.data._M_elems[5] = result.m_backend.data._M_elems[5];
    local_f18.m_backend.data._M_elems._24_5_ = result.m_backend.data._M_elems._24_5_;
    local_f18.m_backend.data._M_elems[7]._1_3_ = result.m_backend.data._M_elems[7]._1_3_;
    local_f18.m_backend.data._M_elems[0] = result.m_backend.data._M_elems[0];
    local_f18.m_backend.data._M_elems[1] = result.m_backend.data._M_elems[1];
    local_f18.m_backend.data._M_elems[2] = result.m_backend.data._M_elems[2];
    local_f18.m_backend.data._M_elems[3] = result.m_backend.data._M_elems[3];
    local_f18.m_backend.exp = result.m_backend.exp;
    local_f18.m_backend.neg = result.m_backend.neg;
    local_f18.m_backend.fpclass = result.m_backend.fpclass;
    local_f18.m_backend.prec_elem = result.m_backend.prec_elem;
    pdVar49 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&aggr_const.m_backend,-*pdVar49,(type *)0x0);
    tVar47 = boost::multiprecision::operator<=
                       ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&local_d98,
                        (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&aggr_const.m_backend);
    if (tVar47) goto LAB_002a5c67;
    pcVar52 = &local_d98;
LAB_002a5cab:
    scale1.m_backend.fpclass = cpp_dec_float_finite;
    scale1.m_backend.prec_elem = 10;
    scale1.m_backend.neg = false;
    scale1.m_backend.exp = 0;
    scale1.m_backend.data._M_elems[9]._1_3_ = 0;
    scale1.m_backend.data._M_elems._32_5_ = 0;
    scale1.m_backend.data._M_elems[7]._1_3_ = 0;
    scale1.m_backend.data._M_elems._24_5_ = 0;
    scale1.m_backend.data._M_elems[4] = 0;
    scale1.m_backend.data._M_elems[5] = 0;
    scale1.m_backend.data._M_elems[2] = 0;
    scale1.m_backend.data._M_elems[3] = 0;
    scale1.m_backend.data._M_elems[0] = 0;
    scale1.m_backend.data._M_elems[1] = 0;
    boost::multiprecision::default_ops::
    eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&scale1.m_backend,&local_e58,pcVar52);
    obj_j.m_backend.fpclass = cpp_dec_float_finite;
    obj_j.m_backend.prec_elem = 10;
    obj_j.m_backend.data._M_elems[0] = 0;
    obj_j.m_backend.data._M_elems[1] = 0;
    obj_j.m_backend.data._M_elems[2] = 0;
    obj_j.m_backend.data._M_elems[3] = 0;
    obj_j.m_backend.data._M_elems[4] = 0;
    obj_j.m_backend.data._M_elems[5] = 0;
    obj_j.m_backend.data._M_elems._24_5_ = 0;
    obj_j.m_backend.data._M_elems[7]._1_3_ = 0;
    obj_j.m_backend.data._M_elems._32_5_ = 0;
    obj_j.m_backend.data._M_elems[9]._1_3_ = 0;
    obj_j.m_backend.exp = 0;
    obj_j.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&obj_j.m_backend,&local_d18,&scale1.m_backend);
    result.m_backend.fpclass = cpp_dec_float_finite;
    result.m_backend.prec_elem = 10;
    result.m_backend.data._M_elems[0] = 0;
    result.m_backend.data._M_elems[1] = 0;
    result.m_backend.data._M_elems[2] = 0;
    result.m_backend.data._M_elems[3] = 0;
    result.m_backend.data._M_elems[4] = 0;
    result.m_backend.data._M_elems[5] = 0;
    result.m_backend.data._M_elems._24_5_ = 0;
    result.m_backend.data._M_elems[7]._1_3_ = 0;
    result.m_backend.data._M_elems._32_5_ = 0;
    result.m_backend.data._M_elems[9]._1_3_ = 0;
    result.m_backend.exp = 0;
    result.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&result.m_backend,&obj_j.m_backend,&local_e98);
  }
  else {
    result.m_backend.fpclass = cpp_dec_float_finite;
    result.m_backend.prec_elem = 10;
    result.m_backend.data._M_elems[0] = 0;
    result.m_backend.data._M_elems[1] = 0;
    result.m_backend.data._M_elems[2] = 0;
    result.m_backend.data._M_elems[3] = 0;
    result.m_backend.data._M_elems[4] = 0;
    result.m_backend.data._M_elems[5] = 0;
    result.m_backend.data._M_elems._24_5_ = 0;
    result.m_backend.data._M_elems[7]._1_3_ = 0;
    result.m_backend.data._M_elems._32_5_ = 0;
    result.m_backend.data._M_elems[9]._1_3_ = 0;
    result.m_backend.exp = 0;
    result.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&result.m_backend,&local_e58,&local_e98);
    aggr_const.m_backend.data._M_elems[0] = 0;
    aggr_const.m_backend.data._M_elems[1] = 0;
    tVar47 = boost::multiprecision::operator>
                       ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&result.m_backend,(double *)&aggr_const);
    if (!tVar47) {
      pSVar50 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)&result,"XMAISM12 This should never happen.",(allocator *)&aggr_const);
      SPxInternalCodeException::SPxInternalCodeException(pSVar50,(string *)&result);
      __cxa_throw(pSVar50,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    }
    pdVar49 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&aggr_const.m_backend,-*pdVar49,(type *)0x0);
    tVar47 = boost::multiprecision::operator<=
                       ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&local_ed8,
                        (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&aggr_const.m_backend);
    if (tVar47) {
      pdVar49 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (&result.m_backend,-*pdVar49,(type *)0x0);
    }
    else {
      scale1.m_backend.fpclass = cpp_dec_float_finite;
      scale1.m_backend.prec_elem = 10;
      scale1.m_backend.data._M_elems[0] = 0;
      scale1.m_backend.data._M_elems[1] = 0;
      scale1.m_backend.data._M_elems[2] = 0;
      scale1.m_backend.data._M_elems[3] = 0;
      scale1.m_backend.data._M_elems[4] = 0;
      scale1.m_backend.data._M_elems[5] = 0;
      scale1.m_backend.data._M_elems._24_5_ = 0;
      scale1.m_backend.data._M_elems[7]._1_3_ = 0;
      scale1.m_backend.data._M_elems._32_5_ = 0;
      scale1.m_backend.data._M_elems[9]._1_3_ = 0;
      scale1.m_backend.exp = 0;
      scale1.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&scale1.m_backend,&local_e98,&local_ed8);
      obj_j.m_backend.fpclass = cpp_dec_float_finite;
      obj_j.m_backend.prec_elem = 10;
      obj_j.m_backend.data._M_elems[0] = 0;
      obj_j.m_backend.data._M_elems[1] = 0;
      obj_j.m_backend.data._M_elems[2] = 0;
      obj_j.m_backend.data._M_elems[3] = 0;
      obj_j.m_backend.data._M_elems[4] = 0;
      obj_j.m_backend.data._M_elems[5] = 0;
      obj_j.m_backend.data._M_elems._24_5_ = 0;
      obj_j.m_backend.data._M_elems[7]._1_3_ = 0;
      obj_j.m_backend.data._M_elems._32_5_ = 0;
      obj_j.m_backend.data._M_elems[9]._1_3_ = 0;
      obj_j.m_backend.exp = 0;
      obj_j.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&obj_j.m_backend,&local_d18,&scale1.m_backend);
      result.m_backend.fpclass = cpp_dec_float_finite;
      result.m_backend.prec_elem = 10;
      result.m_backend.data._M_elems[0] = 0;
      result.m_backend.data._M_elems[1] = 0;
      result.m_backend.data._M_elems[2] = 0;
      result.m_backend.data._M_elems[3] = 0;
      result.m_backend.data._M_elems[4] = 0;
      result.m_backend.data._M_elems[5] = 0;
      result.m_backend.data._M_elems._24_5_ = 0;
      result.m_backend.data._M_elems[7]._1_3_ = 0;
      result.m_backend.data._M_elems._32_5_ = 0;
      result.m_backend.data._M_elems[9]._1_3_ = 0;
      result.m_backend.exp = 0;
      result.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&result.m_backend,&obj_j.m_backend,&local_e58);
    }
    local_c08.m_backend.data._M_elems._32_5_ = result.m_backend.data._M_elems._32_5_;
    local_c08.m_backend.data._M_elems[9]._1_3_ = result.m_backend.data._M_elems[9]._1_3_;
    local_c08.m_backend.data._M_elems[4] = result.m_backend.data._M_elems[4];
    local_c08.m_backend.data._M_elems[5] = result.m_backend.data._M_elems[5];
    local_c08.m_backend.data._M_elems._24_5_ = result.m_backend.data._M_elems._24_5_;
    local_c08.m_backend.data._M_elems[7]._1_3_ = result.m_backend.data._M_elems[7]._1_3_;
    local_c08.m_backend.data._M_elems[0] = result.m_backend.data._M_elems[0];
    local_c08.m_backend.data._M_elems[1] = result.m_backend.data._M_elems[1];
    local_c08.m_backend.data._M_elems[2] = result.m_backend.data._M_elems[2];
    local_c08.m_backend.data._M_elems[3] = result.m_backend.data._M_elems[3];
    local_c08.m_backend.exp = result.m_backend.exp;
    local_c08.m_backend.neg = result.m_backend.neg;
    local_c08.m_backend.fpclass = result.m_backend.fpclass;
    local_c08.m_backend.prec_elem = result.m_backend.prec_elem;
    pdVar49 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&aggr_const.m_backend,*pdVar49,(type *)0x0);
    tVar47 = boost::multiprecision::operator>=
                       ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&local_fa8,
                        (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&aggr_const.m_backend);
    if (tVar47) {
      pdVar49 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (&result.m_backend,*pdVar49,(type *)0x0);
    }
    else {
      scale1.m_backend.fpclass = cpp_dec_float_finite;
      scale1.m_backend.prec_elem = 10;
      scale1.m_backend.data._M_elems[0] = 0;
      scale1.m_backend.data._M_elems[1] = 0;
      scale1.m_backend.data._M_elems[2] = 0;
      scale1.m_backend.data._M_elems[3] = 0;
      scale1.m_backend.data._M_elems[4] = 0;
      scale1.m_backend.data._M_elems[5] = 0;
      scale1.m_backend.data._M_elems._24_5_ = 0;
      scale1.m_backend.data._M_elems[7]._1_3_ = 0;
      scale1.m_backend.data._M_elems._32_5_ = 0;
      scale1.m_backend.data._M_elems[9]._1_3_ = 0;
      scale1.m_backend.exp = 0;
      scale1.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&scale1.m_backend,&local_e98,&local_fa8);
      obj_j.m_backend.fpclass = cpp_dec_float_finite;
      obj_j.m_backend.prec_elem = 10;
      obj_j.m_backend.data._M_elems[0] = 0;
      obj_j.m_backend.data._M_elems[1] = 0;
      obj_j.m_backend.data._M_elems[2] = 0;
      obj_j.m_backend.data._M_elems[3] = 0;
      obj_j.m_backend.data._M_elems[4] = 0;
      obj_j.m_backend.data._M_elems[5] = 0;
      obj_j.m_backend.data._M_elems._24_5_ = 0;
      obj_j.m_backend.data._M_elems[7]._1_3_ = 0;
      obj_j.m_backend.data._M_elems._32_5_ = 0;
      obj_j.m_backend.data._M_elems[9]._1_3_ = 0;
      obj_j.m_backend.exp = 0;
      obj_j.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&obj_j.m_backend,&local_d18,&scale1.m_backend);
      result.m_backend.fpclass = cpp_dec_float_finite;
      result.m_backend.prec_elem = 10;
      result.m_backend.data._M_elems[0] = 0;
      result.m_backend.data._M_elems[1] = 0;
      result.m_backend.data._M_elems[2] = 0;
      result.m_backend.data._M_elems[3] = 0;
      result.m_backend.data._M_elems[4] = 0;
      result.m_backend.data._M_elems[5] = 0;
      result.m_backend.data._M_elems._24_5_ = 0;
      result.m_backend.data._M_elems[7]._1_3_ = 0;
      result.m_backend.data._M_elems._32_5_ = 0;
      result.m_backend.data._M_elems[9]._1_3_ = 0;
      result.m_backend.exp = 0;
      result.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&result.m_backend,&obj_j.m_backend,&local_e58);
    }
    local_c48.m_backend.data._M_elems._32_5_ = result.m_backend.data._M_elems._32_5_;
    local_c48.m_backend.data._M_elems[9]._1_3_ = result.m_backend.data._M_elems[9]._1_3_;
    local_c48.m_backend.data._M_elems[4] = result.m_backend.data._M_elems[4];
    local_c48.m_backend.data._M_elems[5] = result.m_backend.data._M_elems[5];
    local_c48.m_backend.data._M_elems._24_5_ = result.m_backend.data._M_elems._24_5_;
    local_c48.m_backend.data._M_elems[7]._1_3_ = result.m_backend.data._M_elems[7]._1_3_;
    local_c48.m_backend.data._M_elems[0] = result.m_backend.data._M_elems[0];
    local_c48.m_backend.data._M_elems[1] = result.m_backend.data._M_elems[1];
    local_c48.m_backend.data._M_elems[2] = result.m_backend.data._M_elems[2];
    local_c48.m_backend.data._M_elems[3] = result.m_backend.data._M_elems[3];
    local_c48.m_backend.exp = result.m_backend.exp;
    local_c48.m_backend.neg = result.m_backend.neg;
    local_c48.m_backend.fpclass = result.m_backend.fpclass;
    local_c48.m_backend.prec_elem = result.m_backend.prec_elem;
    pdVar49 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&aggr_const.m_backend,-*pdVar49,(type *)0x0);
    tVar47 = boost::multiprecision::operator<=
                       ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&local_d98,
                        (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&aggr_const.m_backend);
    if (tVar47) {
      pdVar49 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (&result.m_backend,-*pdVar49,(type *)0x0);
    }
    else {
      scale1.m_backend.fpclass = cpp_dec_float_finite;
      scale1.m_backend.prec_elem = 10;
      scale1.m_backend.data._M_elems[0] = 0;
      scale1.m_backend.data._M_elems[1] = 0;
      scale1.m_backend.data._M_elems[2] = 0;
      scale1.m_backend.data._M_elems[3] = 0;
      scale1.m_backend.data._M_elems[4] = 0;
      scale1.m_backend.data._M_elems[5] = 0;
      scale1.m_backend.data._M_elems._24_5_ = 0;
      scale1.m_backend.data._M_elems[7]._1_3_ = 0;
      scale1.m_backend.data._M_elems._32_5_ = 0;
      scale1.m_backend.data._M_elems[9]._1_3_ = 0;
      scale1.m_backend.exp = 0;
      scale1.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&scale1.m_backend,&local_e58,&local_d98);
      obj_j.m_backend.fpclass = cpp_dec_float_finite;
      obj_j.m_backend.prec_elem = 10;
      obj_j.m_backend.data._M_elems[0] = 0;
      obj_j.m_backend.data._M_elems[1] = 0;
      obj_j.m_backend.data._M_elems[2] = 0;
      obj_j.m_backend.data._M_elems[3] = 0;
      obj_j.m_backend.data._M_elems[4] = 0;
      obj_j.m_backend.data._M_elems[5] = 0;
      obj_j.m_backend.data._M_elems._24_5_ = 0;
      obj_j.m_backend.data._M_elems[7]._1_3_ = 0;
      obj_j.m_backend.data._M_elems._32_5_ = 0;
      obj_j.m_backend.data._M_elems[9]._1_3_ = 0;
      obj_j.m_backend.exp = 0;
      obj_j.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&obj_j.m_backend,&local_d18,&scale1.m_backend);
      result.m_backend.fpclass = cpp_dec_float_finite;
      result.m_backend.prec_elem = 10;
      result.m_backend.data._M_elems[0] = 0;
      result.m_backend.data._M_elems[1] = 0;
      result.m_backend.data._M_elems[2] = 0;
      result.m_backend.data._M_elems[3] = 0;
      result.m_backend.data._M_elems[4] = 0;
      result.m_backend.data._M_elems[5] = 0;
      result.m_backend.data._M_elems._24_5_ = 0;
      result.m_backend.data._M_elems[7]._1_3_ = 0;
      result.m_backend.data._M_elems._32_5_ = 0;
      result.m_backend.data._M_elems[9]._1_3_ = 0;
      result.m_backend.exp = 0;
      result.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&result.m_backend,&obj_j.m_backend,&local_e98);
    }
    local_f18.m_backend.data._M_elems._32_5_ = result.m_backend.data._M_elems._32_5_;
    local_f18.m_backend.data._M_elems[9]._1_3_ = result.m_backend.data._M_elems[9]._1_3_;
    local_f18.m_backend.data._M_elems[4] = result.m_backend.data._M_elems[4];
    local_f18.m_backend.data._M_elems[5] = result.m_backend.data._M_elems[5];
    local_f18.m_backend.data._M_elems._24_5_ = result.m_backend.data._M_elems._24_5_;
    local_f18.m_backend.data._M_elems[7]._1_3_ = result.m_backend.data._M_elems[7]._1_3_;
    local_f18.m_backend.data._M_elems[0] = result.m_backend.data._M_elems[0];
    local_f18.m_backend.data._M_elems[1] = result.m_backend.data._M_elems[1];
    local_f18.m_backend.data._M_elems[2] = result.m_backend.data._M_elems[2];
    local_f18.m_backend.data._M_elems[3] = result.m_backend.data._M_elems[3];
    local_f18.m_backend.exp = result.m_backend.exp;
    local_f18.m_backend.neg = result.m_backend.neg;
    local_f18.m_backend.fpclass = result.m_backend.fpclass;
    local_f18.m_backend.prec_elem = result.m_backend.prec_elem;
    pdVar49 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&aggr_const.m_backend,*pdVar49,(type *)0x0);
    tVar47 = boost::multiprecision::operator>=
                       ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&local_dd8,
                        (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&aggr_const.m_backend);
    if (!tVar47) {
      pcVar52 = &local_dd8;
      goto LAB_002a5cab;
    }
LAB_002a5c67:
    pdVar49 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&result.m_backend,*pdVar49,(type *)0x0);
  }
  local_f58.m_backend.data._M_elems._32_5_ = result.m_backend.data._M_elems._32_5_;
  local_f58.m_backend.data._M_elems[9]._1_3_ = result.m_backend.data._M_elems[9]._1_3_;
  local_f58.m_backend.data._M_elems[4] = result.m_backend.data._M_elems[4];
  local_f58.m_backend.data._M_elems[5] = result.m_backend.data._M_elems[5];
  local_f58.m_backend.data._M_elems._24_5_ = result.m_backend.data._M_elems._24_5_;
  local_f58.m_backend.data._M_elems[7]._1_3_ = result.m_backend.data._M_elems[7]._1_3_;
  local_f58.m_backend.data._M_elems[0] = result.m_backend.data._M_elems[0];
  local_f58.m_backend.data._M_elems[1] = result.m_backend.data._M_elems[1];
  local_f58.m_backend.data._M_elems[2] = result.m_backend.data._M_elems[2];
  local_f58.m_backend.data._M_elems[3] = result.m_backend.data._M_elems[3];
  local_f58.m_backend.exp = result.m_backend.exp;
  local_f58.m_backend.neg = result.m_backend.neg;
  local_f58.m_backend.fpclass = result.m_backend.fpclass;
  local_f58.m_backend.prec_elem = result.m_backend.prec_elem;
  pdVar49 = (double *)infinity();
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (&result.m_backend,-*pdVar49,(type *)0x0);
  tVar47 = boost::multiprecision::operator<=
                     (&local_c08,
                      (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)&result.m_backend);
  if (tVar47) {
    pdVar49 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&aggr_const.m_backend,*pdVar49,(type *)0x0);
    tVar47 = boost::multiprecision::operator>=
                       (&local_c48,
                        (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&aggr_const.m_backend);
    if (!tVar47) goto LAB_002a5dbc;
LAB_002a659d:
    uVar44 = local_d98._48_8_;
    bVar43 = local_d98.neg;
    iVar11 = local_d98.exp;
    uVar41 = local_d98.data._M_elems._32_8_;
    uVar39 = local_d98.data._M_elems._24_8_;
    uVar37 = local_d98.data._M_elems._16_8_;
    uVar35 = local_d98.data._M_elems._8_8_;
    uVar33 = local_d98.data._M_elems._0_8_;
    uVar32 = local_dd8._48_8_;
    bVar45 = local_dd8.neg;
    iVar9 = local_dd8.exp;
    uVar31 = local_dd8.data._M_elems._32_8_;
    uVar30 = local_dd8.data._M_elems._24_8_;
    uVar29 = local_dd8.data._M_elems._16_8_;
    uVar28 = local_dd8.data._M_elems._8_8_;
    uVar27 = local_dd8.data._M_elems._0_8_;
    uVar26 = local_e58._48_8_;
    bVar46 = local_e58.neg;
    iVar6 = local_e58.exp;
    uVar24 = local_e58.data._M_elems._32_8_;
    uVar22 = local_e58.data._M_elems._24_8_;
    uVar20 = local_e58.data._M_elems._16_8_;
    uVar18 = local_e58.data._M_elems._8_8_;
    uVar16 = local_e58.data._M_elems._0_8_;
    result.m_backend.data._M_elems._32_5_ = local_e58.data._M_elems._32_5_;
    result.m_backend.data._M_elems[9]._1_3_ = local_e58.data._M_elems[9]._1_3_;
    result.m_backend.data._M_elems[4] = local_e58.data._M_elems[4];
    result.m_backend.data._M_elems[5] = local_e58.data._M_elems[5];
    result.m_backend.data._M_elems._24_5_ = local_e58.data._M_elems._24_5_;
    result.m_backend.data._M_elems[7]._1_3_ = local_e58.data._M_elems[7]._1_3_;
    result.m_backend.data._M_elems[0] = local_e58.data._M_elems[0];
    result.m_backend.data._M_elems[1] = local_e58.data._M_elems[1];
    result.m_backend.data._M_elems[2] = local_e58.data._M_elems[2];
    result.m_backend.data._M_elems[3] = local_e58.data._M_elems[3];
    obj_j.m_backend.data._M_elems._32_5_ = local_dd8.data._M_elems._32_5_;
    obj_j.m_backend.data._M_elems[9]._1_3_ = local_dd8.data._M_elems[9]._1_3_;
    obj_j.m_backend.data._M_elems[4] = local_dd8.data._M_elems[4];
    obj_j.m_backend.data._M_elems[5] = local_dd8.data._M_elems[5];
    obj_j.m_backend.data._M_elems._24_5_ = local_dd8.data._M_elems._24_5_;
    obj_j.m_backend.data._M_elems[7]._1_3_ = local_dd8.data._M_elems[7]._1_3_;
    obj_j.m_backend.data._M_elems[0] = local_dd8.data._M_elems[0];
    obj_j.m_backend.data._M_elems[1] = local_dd8.data._M_elems[1];
    obj_j.m_backend.data._M_elems[2] = local_dd8.data._M_elems[2];
    obj_j.m_backend.data._M_elems[3] = local_dd8.data._M_elems[3];
    local_e58.data._M_elems[8] = local_e98.data._M_elems[8];
    local_e58.data._M_elems[9] = local_e98.data._M_elems[9];
    uVar25 = local_e58.data._M_elems._32_8_;
    local_e58.data._M_elems[4] = local_e98.data._M_elems[4];
    local_e58.data._M_elems[5] = local_e98.data._M_elems[5];
    uVar21 = local_e58.data._M_elems._16_8_;
    local_e58.data._M_elems[6] = local_e98.data._M_elems[6];
    local_e58.data._M_elems[7] = local_e98.data._M_elems[7];
    uVar23 = local_e58.data._M_elems._24_8_;
    local_e58.data._M_elems[0] = local_e98.data._M_elems[0];
    local_e58.data._M_elems[1] = local_e98.data._M_elems[1];
    uVar17 = local_e58.data._M_elems._0_8_;
    local_e58.data._M_elems[2] = local_e98.data._M_elems[2];
    local_e58.data._M_elems[3] = local_e98.data._M_elems[3];
    uVar19 = local_e58.data._M_elems._8_8_;
    local_e58.exp = local_e98.exp;
    local_e58.neg = local_e98.neg;
    local_e58.data._M_elems[8] = (uint)uVar24;
    local_e58.data._M_elems[9] = SUB84(uVar24,4);
    local_e98.data._M_elems[8] = local_e58.data._M_elems[8];
    local_e98.data._M_elems[9] = local_e58.data._M_elems[9];
    local_e58.data._M_elems[6] = (uint)uVar22;
    local_e58.data._M_elems[7] = SUB84(uVar22,4);
    local_e98.data._M_elems[6] = local_e58.data._M_elems[6];
    local_e98.data._M_elems[7] = local_e58.data._M_elems[7];
    local_e58.data._M_elems[4] = (uint)uVar20;
    local_e58.data._M_elems[5] = SUB84(uVar20,4);
    local_e98.data._M_elems[4] = local_e58.data._M_elems[4];
    local_e98.data._M_elems[5] = local_e58.data._M_elems[5];
    local_e58.data._M_elems[0] = (uint)uVar16;
    local_e58.data._M_elems[1] = SUB84(uVar16,4);
    local_e98.data._M_elems[0] = local_e58.data._M_elems[0];
    local_e98.data._M_elems[1] = local_e58.data._M_elems[1];
    local_e58.data._M_elems[2] = (uint)uVar18;
    local_e58.data._M_elems[3] = SUB84(uVar18,4);
    local_e98.data._M_elems[2] = local_e58.data._M_elems[2];
    local_e98.data._M_elems[3] = local_e58.data._M_elems[3];
    local_e98.exp = iVar6;
    local_e98.neg = bVar46;
    local_e58.fpclass = local_e98.fpclass;
    local_e58.prec_elem = local_e98.prec_elem;
    uVar16 = local_e58._48_8_;
    local_e58.fpclass = (fpclass_type)uVar26;
    local_e58.prec_elem = SUB84(uVar26,4);
    local_e98.fpclass = local_e58.fpclass;
    local_e98.prec_elem = local_e58.prec_elem;
    local_d98.data._M_elems[8] = local_ed8.data._M_elems[8];
    local_d98.data._M_elems[9] = local_ed8.data._M_elems[9];
    uVar42 = local_d98.data._M_elems._32_8_;
    local_d98.data._M_elems[4] = local_ed8.data._M_elems[4];
    local_d98.data._M_elems[5] = local_ed8.data._M_elems[5];
    uVar38 = local_d98.data._M_elems._16_8_;
    local_d98.data._M_elems[6] = local_ed8.data._M_elems[6];
    local_d98.data._M_elems[7] = local_ed8.data._M_elems[7];
    uVar40 = local_d98.data._M_elems._24_8_;
    local_d98.data._M_elems[0] = local_ed8.data._M_elems[0];
    local_d98.data._M_elems[1] = local_ed8.data._M_elems[1];
    uVar34 = local_d98.data._M_elems._0_8_;
    local_d98.data._M_elems[2] = local_ed8.data._M_elems[2];
    local_d98.data._M_elems[3] = local_ed8.data._M_elems[3];
    uVar36 = local_d98.data._M_elems._8_8_;
    local_d98.exp = local_ed8.exp;
    local_d98.neg = local_ed8.neg;
    local_d98.data._M_elems[8] = (uint)uVar41;
    local_d98.data._M_elems[9] = SUB84(uVar41,4);
    local_ed8.data._M_elems[8] = local_d98.data._M_elems[8];
    local_ed8.data._M_elems[9] = local_d98.data._M_elems[9];
    local_d98.data._M_elems[6] = (uint)uVar39;
    local_d98.data._M_elems[7] = SUB84(uVar39,4);
    local_ed8.data._M_elems[6] = local_d98.data._M_elems[6];
    local_ed8.data._M_elems[7] = local_d98.data._M_elems[7];
    local_d98.data._M_elems[4] = (uint)uVar37;
    local_d98.data._M_elems[5] = SUB84(uVar37,4);
    local_ed8.data._M_elems[4] = local_d98.data._M_elems[4];
    local_ed8.data._M_elems[5] = local_d98.data._M_elems[5];
    local_d98.data._M_elems[0] = (uint)uVar33;
    local_d98.data._M_elems[1] = SUB84(uVar33,4);
    local_ed8.data._M_elems[0] = local_d98.data._M_elems[0];
    local_ed8.data._M_elems[1] = local_d98.data._M_elems[1];
    local_d98.data._M_elems[2] = (uint)uVar35;
    local_d98.data._M_elems[3] = SUB84(uVar35,4);
    local_ed8.data._M_elems[2] = local_d98.data._M_elems[2];
    local_ed8.data._M_elems[3] = local_d98.data._M_elems[3];
    local_ed8.exp = iVar11;
    local_ed8.neg = bVar43;
    local_d98.fpclass = local_ed8.fpclass;
    local_d98.prec_elem = local_ed8.prec_elem;
    uVar33 = local_d98._48_8_;
    local_d98.fpclass = (fpclass_type)uVar44;
    local_d98.prec_elem = SUB84(uVar44,4);
    local_ed8.fpclass = local_d98.fpclass;
    local_ed8.prec_elem = local_d98.prec_elem;
    local_dd8.data._M_elems[8] = local_fa8.data._M_elems[8];
    local_dd8.data._M_elems[9] = local_fa8.data._M_elems[9];
    uVar26 = local_dd8.data._M_elems._32_8_;
    local_dd8.data._M_elems[4] = local_fa8.data._M_elems[4];
    local_dd8.data._M_elems[5] = local_fa8.data._M_elems[5];
    uVar22 = local_dd8.data._M_elems._16_8_;
    local_dd8.data._M_elems[6] = local_fa8.data._M_elems[6];
    local_dd8.data._M_elems[7] = local_fa8.data._M_elems[7];
    uVar24 = local_dd8.data._M_elems._24_8_;
    local_dd8.data._M_elems[0] = local_fa8.data._M_elems[0];
    local_dd8.data._M_elems[1] = local_fa8.data._M_elems[1];
    uVar18 = local_dd8.data._M_elems._0_8_;
    local_dd8.data._M_elems[2] = local_fa8.data._M_elems[2];
    local_dd8.data._M_elems[3] = local_fa8.data._M_elems[3];
    uVar20 = local_dd8.data._M_elems._8_8_;
    local_dd8.exp = local_fa8.exp;
    local_dd8.neg = local_fa8.neg;
    local_dd8.data._M_elems[8] = (uint)uVar31;
    local_dd8.data._M_elems[9] = SUB84(uVar31,4);
    local_fa8.data._M_elems[8] = local_dd8.data._M_elems[8];
    local_fa8.data._M_elems[9] = local_dd8.data._M_elems[9];
    local_dd8.data._M_elems[6] = (uint)uVar30;
    local_dd8.data._M_elems[7] = SUB84(uVar30,4);
    local_fa8.data._M_elems[6] = local_dd8.data._M_elems[6];
    local_fa8.data._M_elems[7] = local_dd8.data._M_elems[7];
    local_dd8.data._M_elems[4] = (uint)uVar29;
    local_dd8.data._M_elems[5] = SUB84(uVar29,4);
    local_fa8.data._M_elems[4] = local_dd8.data._M_elems[4];
    local_fa8.data._M_elems[5] = local_dd8.data._M_elems[5];
    local_dd8.data._M_elems[0] = (uint)uVar27;
    local_dd8.data._M_elems[1] = SUB84(uVar27,4);
    local_fa8.data._M_elems[0] = local_dd8.data._M_elems[0];
    local_fa8.data._M_elems[1] = local_dd8.data._M_elems[1];
    local_dd8.data._M_elems[2] = (uint)uVar28;
    local_dd8.data._M_elems[3] = SUB84(uVar28,4);
    local_fa8.data._M_elems[2] = local_dd8.data._M_elems[2];
    local_fa8.data._M_elems[3] = local_dd8.data._M_elems[3];
    local_fa8.exp = iVar9;
    local_fa8.neg = bVar45;
    local_dd8.fpclass = local_fa8.fpclass;
    local_dd8.prec_elem = local_fa8.prec_elem;
    uVar27 = local_dd8._48_8_;
    local_dd8.fpclass = (fpclass_type)uVar32;
    local_dd8.prec_elem = SUB84(uVar32,4);
    local_fa8.fpclass = local_dd8.fpclass;
    local_fa8.prec_elem = local_dd8.prec_elem;
    lVar57 = local_cd8;
    lVar54 = local_f70;
    local_1004 = local_1000;
    local_1000 = uVar7;
    local_e58.data._M_elems._0_8_ = uVar17;
    local_e58.data._M_elems._8_8_ = uVar19;
    local_e58.data._M_elems._16_8_ = uVar21;
    local_e58.data._M_elems._24_8_ = uVar23;
    local_e58.data._M_elems._32_8_ = uVar25;
    local_e58._48_8_ = uVar16;
    local_dd8.data._M_elems._0_8_ = uVar18;
    local_dd8.data._M_elems._8_8_ = uVar20;
    local_dd8.data._M_elems._16_8_ = uVar22;
    local_dd8.data._M_elems._24_8_ = uVar24;
    local_dd8.data._M_elems._32_8_ = uVar26;
    local_dd8._48_8_ = uVar27;
    local_d98.data._M_elems._0_8_ = uVar34;
    local_d98.data._M_elems._8_8_ = uVar36;
    local_d98.data._M_elems._16_8_ = uVar38;
    local_d98.data._M_elems._24_8_ = uVar40;
    local_d98.data._M_elems._32_8_ = uVar42;
    local_d98._48_8_ = uVar33;
  }
  else {
LAB_002a5dbc:
    pdVar49 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&result.m_backend,-*pdVar49,(type *)0x0);
    tVar47 = boost::multiprecision::operator<=
                       (&local_f18,
                        (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&result.m_backend);
    local_1004 = uVar7;
    if (tVar47) {
      pdVar49 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (&aggr_const.m_backend,*pdVar49,(type *)0x0);
      tVar47 = boost::multiprecision::operator>=
                         (&local_f58,
                          (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&aggr_const.m_backend);
      lVar57 = local_f70;
      lVar54 = local_cd8;
      if (!tVar47) goto LAB_002a5e22;
      goto LAB_002a6891;
    }
LAB_002a5e22:
    local_7b8.m_backend.data._M_elems[9]._1_3_ = local_c08.m_backend.data._M_elems[9]._1_3_;
    local_7b8.m_backend.data._M_elems._32_5_ = local_c08.m_backend.data._M_elems._32_5_;
    local_7b8.m_backend.data._M_elems[7]._1_3_ = local_c08.m_backend.data._M_elems[7]._1_3_;
    local_7b8.m_backend.data._M_elems._24_5_ = local_c08.m_backend.data._M_elems._24_5_;
    local_7b8.m_backend.data._M_elems[4] = local_c08.m_backend.data._M_elems[4];
    local_7b8.m_backend.data._M_elems[5] = local_c08.m_backend.data._M_elems[5];
    local_7b8.m_backend.data._M_elems[0] = local_c08.m_backend.data._M_elems[0];
    local_7b8.m_backend.data._M_elems[1] = local_c08.m_backend.data._M_elems[1];
    local_7b8.m_backend.data._M_elems[2] = local_c08.m_backend.data._M_elems[2];
    local_7b8.m_backend.data._M_elems[3] = local_c08.m_backend.data._M_elems[3];
    local_7b8.m_backend.exp = local_c08.m_backend.exp;
    local_7b8.m_backend.neg = local_c08.m_backend.neg;
    local_7b8.m_backend.fpclass = local_c08.m_backend.fpclass;
    local_7b8.m_backend.prec_elem = local_c08.m_backend.prec_elem;
    local_7f8.m_backend.data._M_elems[0] = local_d98.data._M_elems[0];
    local_7f8.m_backend.data._M_elems[1] = local_d98.data._M_elems[1];
    local_7f8.m_backend.data._M_elems[2] = local_d98.data._M_elems[2];
    local_7f8.m_backend.data._M_elems[3] = local_d98.data._M_elems[3];
    local_7f8.m_backend.data._M_elems[4] = local_d98.data._M_elems[4];
    local_7f8.m_backend.data._M_elems[5] = local_d98.data._M_elems[5];
    local_7f8.m_backend.data._M_elems[6] = local_d98.data._M_elems[6];
    local_7f8.m_backend.data._M_elems[7] = local_d98.data._M_elems[7];
    local_7f8.m_backend.data._M_elems[8] = local_d98.data._M_elems[8];
    local_7f8.m_backend.data._M_elems[9] = local_d98.data._M_elems[9];
    local_7f8.m_backend.exp = local_d98.exp;
    local_7f8.m_backend.neg = local_d98.neg;
    local_7f8.m_backend.fpclass = local_d98.fpclass;
    local_7f8.m_backend.prec_elem = local_d98.prec_elem;
    psVar2 = &(this->
              super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              )._tolerances;
    std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)&result,
               &psVar2->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
    RVar58 = Tolerances::epsilon((Tolerances *)result.m_backend.data._M_elems._0_8_);
    bVar46 = LE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                       (&local_7b8,&local_7f8,RVar58);
    if (bVar46) {
      local_838.m_backend.data._M_elems[9]._1_3_ = local_c48.m_backend.data._M_elems[9]._1_3_;
      local_838.m_backend.data._M_elems._32_5_ = local_c48.m_backend.data._M_elems._32_5_;
      local_838.m_backend.data._M_elems[7]._1_3_ = local_c48.m_backend.data._M_elems[7]._1_3_;
      local_838.m_backend.data._M_elems._24_5_ = local_c48.m_backend.data._M_elems._24_5_;
      local_838.m_backend.data._M_elems[4] = local_c48.m_backend.data._M_elems[4];
      local_838.m_backend.data._M_elems[5] = local_c48.m_backend.data._M_elems[5];
      local_838.m_backend.data._M_elems[0] = local_c48.m_backend.data._M_elems[0];
      local_838.m_backend.data._M_elems[1] = local_c48.m_backend.data._M_elems[1];
      local_838.m_backend.data._M_elems[2] = local_c48.m_backend.data._M_elems[2];
      local_838.m_backend.data._M_elems[3] = local_c48.m_backend.data._M_elems[3];
      local_838.m_backend.exp = local_c48.m_backend.exp;
      local_838.m_backend.neg = local_c48.m_backend.neg;
      local_838.m_backend.fpclass = local_c48.m_backend.fpclass;
      local_838.m_backend.prec_elem = local_c48.m_backend.prec_elem;
      local_878.m_backend.data._M_elems[0] = local_dd8.data._M_elems[0];
      local_878.m_backend.data._M_elems[1] = local_dd8.data._M_elems[1];
      local_878.m_backend.data._M_elems[2] = local_dd8.data._M_elems[2];
      local_878.m_backend.data._M_elems[3] = local_dd8.data._M_elems[3];
      local_878.m_backend.data._M_elems[4] = local_dd8.data._M_elems[4];
      local_878.m_backend.data._M_elems[5] = local_dd8.data._M_elems[5];
      local_878.m_backend.data._M_elems[6] = local_dd8.data._M_elems[6];
      local_878.m_backend.data._M_elems[7] = local_dd8.data._M_elems[7];
      local_878.m_backend.data._M_elems[8] = local_dd8.data._M_elems[8];
      local_878.m_backend.data._M_elems[9] = local_dd8.data._M_elems[9];
      local_878.m_backend.exp = local_dd8.exp;
      local_878.m_backend.neg = local_dd8.neg;
      local_878.m_backend.fpclass = local_dd8.fpclass;
      local_878.m_backend.prec_elem = local_dd8.prec_elem;
      std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)&aggr_const,
                 &psVar2->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
      RVar58 = Tolerances::epsilon((Tolerances *)aggr_const.m_backend.data._M_elems._0_8_);
      bVar46 = GE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                         (&local_838,&local_878,RVar58);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 (aggr_const.m_backend.data._M_elems + 2));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(result.m_backend.data._M_elems + 2))
      ;
      if (!bVar46) goto LAB_002a62a1;
      local_8b8.m_backend.data._M_elems[9]._1_3_ = local_f18.m_backend.data._M_elems[9]._1_3_;
      local_8b8.m_backend.data._M_elems._32_5_ = local_f18.m_backend.data._M_elems._32_5_;
      local_8b8.m_backend.data._M_elems[7]._1_3_ = local_f18.m_backend.data._M_elems[7]._1_3_;
      local_8b8.m_backend.data._M_elems._24_5_ = local_f18.m_backend.data._M_elems._24_5_;
      local_8b8.m_backend.data._M_elems[4] = local_f18.m_backend.data._M_elems[4];
      local_8b8.m_backend.data._M_elems[5] = local_f18.m_backend.data._M_elems[5];
      local_8b8.m_backend.data._M_elems[0] = local_f18.m_backend.data._M_elems[0];
      local_8b8.m_backend.data._M_elems[1] = local_f18.m_backend.data._M_elems[1];
      local_8b8.m_backend.data._M_elems[2] = local_f18.m_backend.data._M_elems[2];
      local_8b8.m_backend.data._M_elems[3] = local_f18.m_backend.data._M_elems[3];
      local_8b8.m_backend.exp = local_f18.m_backend.exp;
      local_8b8.m_backend.neg = local_f18.m_backend.neg;
      local_8b8.m_backend.fpclass = local_f18.m_backend.fpclass;
      local_8b8.m_backend.prec_elem = local_f18.m_backend.prec_elem;
      local_8f8.m_backend.data._M_elems[0] = local_ed8.data._M_elems[0];
      local_8f8.m_backend.data._M_elems[1] = local_ed8.data._M_elems[1];
      local_8f8.m_backend.data._M_elems[2] = local_ed8.data._M_elems[2];
      local_8f8.m_backend.data._M_elems[3] = local_ed8.data._M_elems[3];
      local_8f8.m_backend.data._M_elems[4] = local_ed8.data._M_elems[4];
      local_8f8.m_backend.data._M_elems[5] = local_ed8.data._M_elems[5];
      local_8f8.m_backend.data._M_elems[6] = local_ed8.data._M_elems[6];
      local_8f8.m_backend.data._M_elems[7] = local_ed8.data._M_elems[7];
      local_8f8.m_backend.data._M_elems[8] = local_ed8.data._M_elems[8];
      local_8f8.m_backend.data._M_elems[9] = local_ed8.data._M_elems[9];
      local_8f8.m_backend.exp = local_ed8.exp;
      local_8f8.m_backend.neg = local_ed8.neg;
      local_8f8.m_backend.fpclass = local_ed8.fpclass;
      local_8f8.m_backend.prec_elem = local_ed8.prec_elem;
      std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)&result,
                 &psVar2->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
      RVar58 = Tolerances::epsilon((Tolerances *)result.m_backend.data._M_elems._0_8_);
      bVar46 = LE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                         (&local_8b8,&local_8f8,RVar58);
      if (bVar46) {
        local_938.m_backend.data._M_elems[9]._1_3_ = local_f58.m_backend.data._M_elems[9]._1_3_;
        local_938.m_backend.data._M_elems._32_5_ = local_f58.m_backend.data._M_elems._32_5_;
        local_938.m_backend.data._M_elems[7]._1_3_ = local_f58.m_backend.data._M_elems[7]._1_3_;
        local_938.m_backend.data._M_elems._24_5_ = local_f58.m_backend.data._M_elems._24_5_;
        local_938.m_backend.data._M_elems[4] = local_f58.m_backend.data._M_elems[4];
        local_938.m_backend.data._M_elems[5] = local_f58.m_backend.data._M_elems[5];
        local_938.m_backend.data._M_elems[0] = local_f58.m_backend.data._M_elems[0];
        local_938.m_backend.data._M_elems[1] = local_f58.m_backend.data._M_elems[1];
        local_938.m_backend.data._M_elems[2] = local_f58.m_backend.data._M_elems[2];
        local_938.m_backend.data._M_elems[3] = local_f58.m_backend.data._M_elems[3];
        local_938.m_backend.exp = local_f58.m_backend.exp;
        local_938.m_backend.neg = local_f58.m_backend.neg;
        local_938.m_backend.fpclass = local_f58.m_backend.fpclass;
        local_938.m_backend.prec_elem = local_f58.m_backend.prec_elem;
        local_978.m_backend.data._M_elems[0] = local_fa8.data._M_elems[0];
        local_978.m_backend.data._M_elems[1] = local_fa8.data._M_elems[1];
        local_978.m_backend.data._M_elems[2] = local_fa8.data._M_elems[2];
        local_978.m_backend.data._M_elems[3] = local_fa8.data._M_elems[3];
        local_978.m_backend.data._M_elems[4] = local_fa8.data._M_elems[4];
        local_978.m_backend.data._M_elems[5] = local_fa8.data._M_elems[5];
        local_978.m_backend.data._M_elems[6] = local_fa8.data._M_elems[6];
        local_978.m_backend.data._M_elems[7] = local_fa8.data._M_elems[7];
        local_978.m_backend.data._M_elems[8] = local_fa8.data._M_elems[8];
        local_978.m_backend.data._M_elems[9] = local_fa8.data._M_elems[9];
        local_978.m_backend.exp = local_fa8.exp;
        local_978.m_backend.neg = local_fa8.neg;
        local_978.m_backend.fpclass = local_fa8.fpclass;
        local_978.m_backend.prec_elem = local_fa8.prec_elem;
        std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)&aggr_const,
                   &psVar2->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
        RVar58 = Tolerances::epsilon((Tolerances *)aggr_const.m_backend.data._M_elems._0_8_);
        bVar46 = GE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                           (&local_938,&local_978,RVar58);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   (aggr_const.m_backend.data._M_elems + 2));
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   (result.m_backend.data._M_elems + 2));
        lVar57 = local_f70;
        lVar54 = local_cd8;
        if (!bVar46) goto LAB_002a6891;
        local_2f8 = (multiprecision  [8])local_e58.data._M_elems._0_8_;
        auStack_2f0[0] = local_e58.data._M_elems[2];
        auStack_2f0[1] = local_e58.data._M_elems[3];
        local_2e8[0] = local_e58.data._M_elems[4];
        local_2e8[1] = local_e58.data._M_elems[5];
        auStack_2e0[0] = local_e58.data._M_elems[6];
        auStack_2e0[1] = local_e58.data._M_elems[7];
        local_2d8[0] = local_e58.data._M_elems[8];
        local_2d8[1] = local_e58.data._M_elems[9];
        local_2d0 = local_e58.exp;
        local_2cc = (multiprecision)local_e58.neg;
        local_2c8 = local_e58.fpclass;
        iStack_2c4 = local_e58.prec_elem;
        boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&result,local_2f8,arg);
        this_01 = local_338;
        pnVar53 = extraout_RDX;
        goto LAB_002a6525;
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(result.m_backend.data._M_elems + 2))
      ;
      lVar57 = local_f70;
      lVar54 = local_cd8;
    }
    else {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(result.m_backend.data._M_elems + 2))
      ;
LAB_002a62a1:
      local_9b8.m_backend.data._M_elems[9]._1_3_ = local_f18.m_backend.data._M_elems[9]._1_3_;
      local_9b8.m_backend.data._M_elems._32_5_ = local_f18.m_backend.data._M_elems._32_5_;
      local_9b8.m_backend.data._M_elems[7]._1_3_ = local_f18.m_backend.data._M_elems[7]._1_3_;
      local_9b8.m_backend.data._M_elems._24_5_ = local_f18.m_backend.data._M_elems._24_5_;
      local_9b8.m_backend.data._M_elems[4] = local_f18.m_backend.data._M_elems[4];
      local_9b8.m_backend.data._M_elems[5] = local_f18.m_backend.data._M_elems[5];
      local_9b8.m_backend.data._M_elems[0] = local_f18.m_backend.data._M_elems[0];
      local_9b8.m_backend.data._M_elems[1] = local_f18.m_backend.data._M_elems[1];
      local_9b8.m_backend.data._M_elems[2] = local_f18.m_backend.data._M_elems[2];
      local_9b8.m_backend.data._M_elems[3] = local_f18.m_backend.data._M_elems[3];
      local_9b8.m_backend.exp = local_f18.m_backend.exp;
      local_9b8.m_backend.neg = local_f18.m_backend.neg;
      local_9b8.m_backend.fpclass = local_f18.m_backend.fpclass;
      local_9b8.m_backend.prec_elem = local_f18.m_backend.prec_elem;
      local_9f8.m_backend.data._M_elems[0] = local_ed8.data._M_elems[0];
      local_9f8.m_backend.data._M_elems[1] = local_ed8.data._M_elems[1];
      local_9f8.m_backend.data._M_elems[2] = local_ed8.data._M_elems[2];
      local_9f8.m_backend.data._M_elems[3] = local_ed8.data._M_elems[3];
      local_9f8.m_backend.data._M_elems[4] = local_ed8.data._M_elems[4];
      local_9f8.m_backend.data._M_elems[5] = local_ed8.data._M_elems[5];
      local_9f8.m_backend.data._M_elems[6] = local_ed8.data._M_elems[6];
      local_9f8.m_backend.data._M_elems[7] = local_ed8.data._M_elems[7];
      local_9f8.m_backend.data._M_elems[8] = local_ed8.data._M_elems[8];
      local_9f8.m_backend.data._M_elems[9] = local_ed8.data._M_elems[9];
      local_9f8.m_backend.exp = local_ed8.exp;
      local_9f8.m_backend.neg = local_ed8.neg;
      local_9f8.m_backend.fpclass = local_ed8.fpclass;
      local_9f8.m_backend.prec_elem = local_ed8.prec_elem;
      std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)&result,
                 &psVar2->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
      RVar58 = Tolerances::epsilon((Tolerances *)result.m_backend.data._M_elems._0_8_);
      bVar46 = LE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                         (&local_9b8,&local_9f8,RVar58);
      if (bVar46) {
        local_a38.m_backend.data._M_elems[9]._1_3_ = local_f58.m_backend.data._M_elems[9]._1_3_;
        local_a38.m_backend.data._M_elems._32_5_ = local_f58.m_backend.data._M_elems._32_5_;
        local_a38.m_backend.data._M_elems[7]._1_3_ = local_f58.m_backend.data._M_elems[7]._1_3_;
        local_a38.m_backend.data._M_elems._24_5_ = local_f58.m_backend.data._M_elems._24_5_;
        local_a38.m_backend.data._M_elems[4] = local_f58.m_backend.data._M_elems[4];
        local_a38.m_backend.data._M_elems[5] = local_f58.m_backend.data._M_elems[5];
        local_a38.m_backend.data._M_elems[0] = local_f58.m_backend.data._M_elems[0];
        local_a38.m_backend.data._M_elems[1] = local_f58.m_backend.data._M_elems[1];
        local_a38.m_backend.data._M_elems[2] = local_f58.m_backend.data._M_elems[2];
        local_a38.m_backend.data._M_elems[3] = local_f58.m_backend.data._M_elems[3];
        local_a38.m_backend.exp = local_f58.m_backend.exp;
        local_a38.m_backend.neg = local_f58.m_backend.neg;
        local_a38.m_backend.fpclass = local_f58.m_backend.fpclass;
        local_a38.m_backend.prec_elem = local_f58.m_backend.prec_elem;
        local_a78.m_backend.data._M_elems[0] = local_fa8.data._M_elems[0];
        local_a78.m_backend.data._M_elems[1] = local_fa8.data._M_elems[1];
        local_a78.m_backend.data._M_elems[2] = local_fa8.data._M_elems[2];
        local_a78.m_backend.data._M_elems[3] = local_fa8.data._M_elems[3];
        local_a78.m_backend.data._M_elems[4] = local_fa8.data._M_elems[4];
        local_a78.m_backend.data._M_elems[5] = local_fa8.data._M_elems[5];
        local_a78.m_backend.data._M_elems[6] = local_fa8.data._M_elems[6];
        local_a78.m_backend.data._M_elems[7] = local_fa8.data._M_elems[7];
        local_a78.m_backend.data._M_elems[8] = local_fa8.data._M_elems[8];
        local_a78.m_backend.data._M_elems[9] = local_fa8.data._M_elems[9];
        local_a78.m_backend.exp = local_fa8.exp;
        local_a78.m_backend.neg = local_fa8.neg;
        local_a78.m_backend.fpclass = local_fa8.fpclass;
        local_a78.m_backend.prec_elem = local_fa8.prec_elem;
        std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)&aggr_const,
                   &psVar2->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
        RVar58 = Tolerances::epsilon((Tolerances *)aggr_const.m_backend.data._M_elems._0_8_);
        bVar46 = GE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                           (&local_a38,&local_a78,RVar58);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   (aggr_const.m_backend.data._M_elems + 2));
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   (result.m_backend.data._M_elems + 2));
        pnVar53 = extraout_RDX_00;
        if (bVar46) goto LAB_002a659d;
      }
      else {
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   (result.m_backend.data._M_elems + 2));
        pnVar53 = extraout_RDX_01;
      }
      local_378[0] = local_e58.data._M_elems[0];
      local_378[1] = local_e58.data._M_elems[1];
      auStack_370[0] = local_e58.data._M_elems[2];
      auStack_370[1] = local_e58.data._M_elems[3];
      local_368[0] = local_e58.data._M_elems[4];
      local_368[1] = local_e58.data._M_elems[5];
      auStack_360[0] = local_e58.data._M_elems[6];
      auStack_360[1] = local_e58.data._M_elems[7];
      local_358[0] = local_e58.data._M_elems[8];
      local_358[1] = local_e58.data._M_elems[9];
      local_350 = local_e58.exp;
      local_34c = (multiprecision)local_e58.neg;
      local_348 = local_e58.fpclass;
      iStack_344 = local_e58.prec_elem;
      boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&result,(multiprecision *)local_378,pnVar53);
      this_01 = local_3b8;
      pnVar53 = extraout_RDX_02;
LAB_002a6525:
      *(undefined8 *)this_01 = local_e98.data._M_elems._0_8_;
      *(undefined8 *)(this_01 + 8) = local_e98.data._M_elems._8_8_;
      *(undefined8 *)(this_01 + 0x10) = local_e98.data._M_elems._16_8_;
      *(undefined8 *)(this_01 + 0x18) = local_e98.data._M_elems._24_8_;
      *(undefined8 *)(this_01 + 0x20) = local_e98.data._M_elems._32_8_;
      *(int *)(this_01 + 0x28) = local_e98.exp;
      this_01[0x2c] = (multiprecision)local_e98.neg;
      *(undefined8 *)(this_01 + 0x30) = local_e98._48_8_;
      boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&aggr_const,this_01,pnVar53);
      tVar47 = boost::multiprecision::operator>(&result,&aggr_const);
      lVar57 = local_f70;
      lVar54 = local_cd8;
      if (!tVar47) goto LAB_002a659d;
    }
  }
LAB_002a6891:
  pIVar56 = (lp->
            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.theitem;
  pDVar15 = (lp->
            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.thekey;
  iVar6 = pDVar15[lVar54].idx;
  iVar9 = pDVar15[lVar57].idx;
  aggr_const.m_backend.fpclass = cpp_dec_float_finite;
  aggr_const.m_backend.prec_elem = 10;
  aggr_const.m_backend.data._M_elems[0] = 0;
  aggr_const.m_backend.data._M_elems[1] = 0;
  aggr_const.m_backend.data._M_elems[2] = 0;
  aggr_const.m_backend.data._M_elems[3] = 0;
  aggr_const.m_backend.data._M_elems[4] = 0;
  aggr_const.m_backend.data._M_elems[5] = 0;
  aggr_const.m_backend.data._M_elems._24_5_ = 0;
  aggr_const.m_backend.data._M_elems[7]._1_3_ = 0;
  aggr_const.m_backend.data._M_elems._32_5_ = 0;
  aggr_const.m_backend.data._M_elems[9]._1_3_ = 0;
  aggr_const.m_backend.exp = 0;
  aggr_const.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&aggr_const.m_backend,&local_e98,&local_e58);
  result.m_backend.data._M_elems[0] = aggr_const.m_backend.data._M_elems[0];
  result.m_backend.data._M_elems[1] = aggr_const.m_backend.data._M_elems[1];
  uVar16 = result.m_backend.data._M_elems._0_8_;
  result.m_backend.data._M_elems[2] = aggr_const.m_backend.data._M_elems[2];
  result.m_backend.data._M_elems[3] = aggr_const.m_backend.data._M_elems[3];
  result.m_backend.data._M_elems._32_5_ = aggr_const.m_backend.data._M_elems._32_5_;
  result.m_backend.data._M_elems[9]._1_3_ = aggr_const.m_backend.data._M_elems[9]._1_3_;
  result.m_backend.data._M_elems[4] = aggr_const.m_backend.data._M_elems[4];
  result.m_backend.data._M_elems[5] = aggr_const.m_backend.data._M_elems[5];
  result.m_backend.data._M_elems._24_5_ = aggr_const.m_backend.data._M_elems._24_5_;
  result.m_backend.data._M_elems[7]._1_3_ = aggr_const.m_backend.data._M_elems[7]._1_3_;
  result.m_backend.exp = aggr_const.m_backend.exp;
  result.m_backend.neg = aggr_const.m_backend.neg;
  result.m_backend.fpclass = aggr_const.m_backend.fpclass;
  result.m_backend.prec_elem = aggr_const.m_backend.prec_elem;
  result.m_backend.data._M_elems[0] = aggr_const.m_backend.data._M_elems[0];
  fVar51 = aggr_const.m_backend.fpclass | result.m_backend.data._M_elems[0];
  pcVar52 = (cpp_dec_float<50U,_int,_void> *)(ulong)fVar51;
  if (fVar51 != cpp_dec_float_finite) {
    result.m_backend.neg = (bool)(aggr_const.m_backend.neg ^ 1);
  }
  pIVar55 = pIVar56 + iVar6;
  pIVar56 = pIVar56 + iVar9;
  aggr_const.m_backend.fpclass = cpp_dec_float_finite;
  aggr_const.m_backend.prec_elem = 10;
  aggr_const.m_backend.data._M_elems[0] = 0;
  aggr_const.m_backend.data._M_elems[1] = 0;
  aggr_const.m_backend.data._M_elems[2] = 0;
  aggr_const.m_backend.data._M_elems[3] = 0;
  aggr_const.m_backend.data._M_elems[4] = 0;
  aggr_const.m_backend.data._M_elems[5] = 0;
  aggr_const.m_backend.data._M_elems._24_5_ = 0;
  aggr_const.m_backend.data._M_elems[7]._1_3_ = 0;
  aggr_const.m_backend.data._M_elems._32_5_ = 0;
  aggr_const.m_backend.data._M_elems[9]._1_3_ = 0;
  aggr_const.m_backend.exp = 0;
  aggr_const.m_backend.neg = false;
  result.m_backend.data._M_elems._0_8_ = uVar16;
  boost::multiprecision::default_ops::
  eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&aggr_const.m_backend,&local_d18,&local_e58);
  lVar57 = 0x38;
  local_f68 = pIVar55;
  local_f60 = pIVar56;
  for (lVar54 = 0;
      lVar54 < (pIVar55->data).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .memused; lVar54 = lVar54 + 1) {
    pNVar13 = (pIVar55->data).
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .m_elem;
    uVar7 = *(uint *)((long)(pNVar13->val).m_backend.data._M_elems + lVar57);
    uVar16 = *(undefined8 *)((long)(pNVar13->val).m_backend.data._M_elems + lVar57 + -0x18);
    obj_j.m_backend.data._M_elems._32_5_ = SUB85(uVar16,0);
    obj_j.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar16 >> 0x28);
    puVar3 = (uint *)((long)(&pNVar13->val + -1) + lVar57);
    obj_j.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar3;
    obj_j.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar3 + 2);
    puVar3 = (uint *)((long)(&(pNVar13->val).m_backend.data + -1) + lVar57);
    obj_j.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar3;
    uVar16 = *(undefined8 *)(puVar3 + 2);
    obj_j.m_backend.data._M_elems._24_5_ = SUB85(uVar16,0);
    obj_j.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar16 >> 0x28);
    obj_j.m_backend.exp = *(int *)((long)(pNVar13->val).m_backend.data._M_elems + lVar57 + -0x10);
    obj_j.m_backend.neg = *(bool *)((long)(pNVar13->val).m_backend.data._M_elems + lVar57 + -0xc);
    pcVar52 = (cpp_dec_float<50U,_int,_void> *)
              (ulong)CONCAT31((int3)((uint)obj_j.m_backend.exp >> 8),obj_j.m_backend.neg);
    obj_j.m_backend._48_8_ =
         *(undefined8 *)((long)(pNVar13->val).m_backend.data._M_elems + lVar57 + -8);
    if (uVar7 != *i) {
      pnVar12 = (lp->
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).left.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar16 = *(undefined8 *)(pnVar12[(int)uVar7].m_backend.data._M_elems + 8);
      scale1.m_backend.data._M_elems._32_5_ = SUB85(uVar16,0);
      scale1.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar16 >> 0x28);
      scale1.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar12[(int)uVar7].m_backend.data;
      scale1.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)(pnVar12[(int)uVar7].m_backend.data._M_elems + 2);
      puVar3 = pnVar12[(int)uVar7].m_backend.data._M_elems + 4;
      scale1.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar3;
      uVar16 = *(undefined8 *)(puVar3 + 2);
      scale1.m_backend.data._M_elems._24_5_ = SUB85(uVar16,0);
      scale1.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar16 >> 0x28);
      scale1.m_backend.exp = pnVar12[(int)uVar7].m_backend.exp;
      scale1.m_backend.neg = pnVar12[(int)uVar7].m_backend.neg;
      scale1.m_backend.fpclass = pnVar12[(int)uVar7].m_backend.fpclass;
      scale1.m_backend.prec_elem = pnVar12[(int)uVar7].m_backend.prec_elem;
      pnVar12 = (lp->
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).right.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar16 = *(undefined8 *)(pnVar12[(int)uVar7].m_backend.data._M_elems + 8);
      scale2.m_backend.data._M_elems._32_5_ = SUB85(uVar16,0);
      scale2.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar16 >> 0x28);
      scale2.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar12[(int)uVar7].m_backend.data;
      scale2.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)(pnVar12[(int)uVar7].m_backend.data._M_elems + 2);
      puVar3 = pnVar12[(int)uVar7].m_backend.data._M_elems + 4;
      scale2.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar3;
      uVar16 = *(undefined8 *)(puVar3 + 2);
      scale2.m_backend.data._M_elems._24_5_ = SUB85(uVar16,0);
      scale2.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar16 >> 0x28);
      scale2.m_backend.exp = pnVar12[(int)uVar7].m_backend.exp;
      scale2.m_backend.neg = pnVar12[(int)uVar7].m_backend.neg;
      scale2.m_backend.fpclass = pnVar12[(int)uVar7].m_backend.fpclass;
      scale2.m_backend.prec_elem = pnVar12[(int)uVar7].m_backend.prec_elem;
      pdVar49 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (&z1.m_backend,-*pdVar49,(type *)0x0);
      tVar47 = boost::multiprecision::operator>
                         (&scale1,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)&z1.m_backend);
      if (tVar47) {
        z2.m_backend.fpclass = cpp_dec_float_finite;
        z2.m_backend.prec_elem = 10;
        z2.m_backend.data._M_elems[0] = 0;
        z2.m_backend.data._M_elems[1] = 0;
        z2.m_backend.data._M_elems[2] = 0;
        z2.m_backend.data._M_elems[3] = 0;
        z2.m_backend.data._M_elems[4] = 0;
        z2.m_backend.data._M_elems[5] = 0;
        z2.m_backend.data._M_elems._24_5_ = 0;
        z2.m_backend.data._M_elems[7]._1_3_ = 0;
        z2.m_backend.data._M_elems._32_5_ = 0;
        z2.m_backend.data._M_elems[9]._1_3_ = 0;
        z2.m_backend.exp = 0;
        z2.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&z2.m_backend,&aggr_const.m_backend,&obj_j.m_backend);
        pIVar56 = local_f60;
        pIVar55 = local_f68;
        z1.m_backend.fpclass = cpp_dec_float_finite;
        z1.m_backend.prec_elem = 10;
        z1.m_backend.data._M_elems[0] = 0;
        z1.m_backend.data._M_elems[1] = 0;
        z1.m_backend.data._M_elems[2] = 0;
        z1.m_backend.data._M_elems[3] = 0;
        z1.m_backend.data._M_elems[4] = 0;
        z1.m_backend.data._M_elems[5] = 0;
        z1.m_backend.data._M_elems._24_5_ = 0;
        z1.m_backend.data._M_elems[7]._1_3_ = 0;
        z1.m_backend.data._M_elems._32_5_ = 0;
        z1.m_backend.data._M_elems[9]._1_3_ = 0;
        z1.m_backend.exp = 0;
        z1.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&z1.m_backend,&scale1.m_backend,&z2.m_backend);
        (*(lp->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._vptr_ClassArray[0x33])(lp,(ulong)uVar7,&z1.m_backend,0);
        piVar1 = &(this->
                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).m_chgLRhs;
        *piVar1 = *piVar1 + 1;
      }
      pdVar49 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (&z1.m_backend,*pdVar49,(type *)0x0);
      tVar47 = boost::multiprecision::operator<
                         (&scale2,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)&z1.m_backend);
      if (tVar47) {
        z2.m_backend.fpclass = cpp_dec_float_finite;
        z2.m_backend.prec_elem = 10;
        z2.m_backend.data._M_elems[0] = 0;
        z2.m_backend.data._M_elems[1] = 0;
        z2.m_backend.data._M_elems[2] = 0;
        z2.m_backend.data._M_elems[3] = 0;
        z2.m_backend.data._M_elems[4] = 0;
        z2.m_backend.data._M_elems[5] = 0;
        z2.m_backend.data._M_elems._24_5_ = 0;
        z2.m_backend.data._M_elems[7]._1_3_ = 0;
        z2.m_backend.data._M_elems._32_5_ = 0;
        z2.m_backend.data._M_elems[9]._1_3_ = 0;
        z2.m_backend.exp = 0;
        z2.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&z2.m_backend,&aggr_const.m_backend,&obj_j.m_backend);
        pIVar56 = local_f60;
        pIVar55 = local_f68;
        z1.m_backend.fpclass = cpp_dec_float_finite;
        z1.m_backend.prec_elem = 10;
        z1.m_backend.data._M_elems[0] = 0;
        z1.m_backend.data._M_elems[1] = 0;
        z1.m_backend.data._M_elems[2] = 0;
        z1.m_backend.data._M_elems[3] = 0;
        z1.m_backend.data._M_elems[4] = 0;
        z1.m_backend.data._M_elems[5] = 0;
        z1.m_backend.data._M_elems._24_5_ = 0;
        z1.m_backend.data._M_elems[7]._1_3_ = 0;
        z1.m_backend.data._M_elems._32_5_ = 0;
        z1.m_backend.data._M_elems[9]._1_3_ = 0;
        z1.m_backend.exp = 0;
        z1.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&z1.m_backend,&scale2.m_backend,&z2.m_backend);
        (*(lp->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._vptr_ClassArray[0x36])(lp,(ulong)uVar7,&z1.m_backend,0);
        piVar1 = &(this->
                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).m_chgLRhs;
        *piVar1 = *piVar1 + 1;
      }
      z1.m_backend.fpclass = cpp_dec_float_finite;
      z1.m_backend.prec_elem = 10;
      z1.m_backend.data._M_elems[0] = 0;
      z1.m_backend.data._M_elems[1] = 0;
      z1.m_backend.data._M_elems[2] = 0;
      z1.m_backend.data._M_elems[3] = 0;
      z1.m_backend.data._M_elems[4] = 0;
      z1.m_backend.data._M_elems[5] = 0;
      z1.m_backend.data._M_elems._24_5_ = 0;
      z1.m_backend.data._M_elems[7]._1_3_ = 0;
      z1.m_backend.data._M_elems._32_5_ = 0;
      z1.m_backend.data._M_elems[9]._1_3_ = 0;
      z1.m_backend.exp = 0;
      z1.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&z1.m_backend,&result.m_backend,&obj_j.m_backend);
      uVar48 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::pos((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)pIVar56,uVar7);
      if (-1 < (int)uVar48) {
        pNVar13 = (pIVar56->data).
                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .m_elem;
        uVar16 = *(undefined8 *)(pNVar13[uVar48].val.m_backend.data._M_elems + 8);
        z2.m_backend.data._M_elems._32_5_ = SUB85(uVar16,0);
        z2.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar16 >> 0x28);
        z2.m_backend.data._M_elems._0_8_ =
             *(undefined8 *)pNVar13[uVar48].val.m_backend.data._M_elems;
        z2.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)(pNVar13[uVar48].val.m_backend.data._M_elems + 2);
        puVar3 = pNVar13[uVar48].val.m_backend.data._M_elems + 4;
        z2.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar3;
        uVar16 = *(undefined8 *)(puVar3 + 2);
        z2.m_backend.data._M_elems._24_5_ = SUB85(uVar16,0);
        z2.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar16 >> 0x28);
        z2.m_backend.exp = pNVar13[uVar48].val.m_backend.exp;
        z2.m_backend.neg = pNVar13[uVar48].val.m_backend.neg;
        z2.m_backend.fpclass = pNVar13[uVar48].val.m_backend.fpclass;
        z2.m_backend.prec_elem = pNVar13[uVar48].val.m_backend.prec_elem;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                  (&z1.m_backend,&z2.m_backend);
        piVar1 = &(this->
                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).m_remNzos;
        *piVar1 = *piVar1 + 1;
      }
      pcVar52 = &z1.m_backend;
      (*(lp->
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x43])(lp,(ulong)uVar7,(ulong)local_1000,&z1.m_backend,0);
    }
    lVar57 = lVar57 + 0x3c;
  }
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::obj(&obj_j,lp,local_1004);
  local_3f8.m_backend.data._M_elems[9]._1_3_ = obj_j.m_backend.data._M_elems[9]._1_3_;
  local_3f8.m_backend.data._M_elems._32_5_ = obj_j.m_backend.data._M_elems._32_5_;
  local_3f8.m_backend.data._M_elems[7]._1_3_ = obj_j.m_backend.data._M_elems[7]._1_3_;
  local_3f8.m_backend.data._M_elems._24_5_ = obj_j.m_backend.data._M_elems._24_5_;
  local_3f8.m_backend.data._M_elems[4] = obj_j.m_backend.data._M_elems[4];
  local_3f8.m_backend.data._M_elems[5] = obj_j.m_backend.data._M_elems[5];
  local_3f8.m_backend.data._M_elems[0] = obj_j.m_backend.data._M_elems[0];
  local_3f8.m_backend.data._M_elems[1] = obj_j.m_backend.data._M_elems[1];
  local_3f8.m_backend.data._M_elems[2] = obj_j.m_backend.data._M_elems[2];
  local_3f8.m_backend.data._M_elems[3] = obj_j.m_backend.data._M_elems[3];
  local_3f8.m_backend.exp = obj_j.m_backend.exp;
  local_3f8.m_backend.neg = obj_j.m_backend.neg;
  local_3f8.m_backend.fpclass = obj_j.m_backend.fpclass;
  local_3f8.m_backend.prec_elem = obj_j.m_backend.prec_elem;
  epsZero(&local_d8,this);
  bVar46 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                     (&local_3f8,&local_d8);
  if (bVar46) {
    result_28.m_backend.fpclass = cpp_dec_float_finite;
    result_28.m_backend.prec_elem = 10;
    result_28.m_backend.data._M_elems[0] = 0;
    result_28.m_backend.data._M_elems[1] = 0;
    result_28.m_backend.data._M_elems[2] = 0;
    result_28.m_backend.data._M_elems[3] = 0;
    result_28.m_backend.data._M_elems[4] = 0;
    result_28.m_backend.data._M_elems[5] = 0;
    result_28.m_backend.data._M_elems._24_5_ = 0;
    result_28.m_backend.data._M_elems[7]._1_3_ = 0;
    result_28.m_backend.data._M_elems._32_5_ = 0;
    result_28.m_backend._37_8_ = 0;
    boost::multiprecision::default_ops::
    eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&result_28.m_backend,&aggr_const.m_backend,&obj_j.m_backend);
    (*(this->
      super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      )._vptr_SPxSimplifier[0x11])(this,&result_28.m_backend);
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::obj((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)&scale1.m_backend,lp,local_1000);
    z1.m_backend.fpclass = cpp_dec_float_finite;
    z1.m_backend.prec_elem = 10;
    z1.m_backend.data._M_elems[0] = 0;
    z1.m_backend.data._M_elems[1] = 0;
    z1.m_backend.data._M_elems[2] = 0;
    z1.m_backend.data._M_elems[3] = 0;
    z1.m_backend.data._M_elems[4] = 0;
    z1.m_backend.data._M_elems[5] = 0;
    z1.m_backend.data._M_elems._24_5_ = 0;
    z1.m_backend.data._M_elems[7]._1_3_ = 0;
    z1.m_backend.data._M_elems._32_5_ = 0;
    z1.m_backend.data._M_elems[9]._1_3_ = 0;
    z1.m_backend.exp = 0;
    z1.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&z1.m_backend,&result.m_backend,&obj_j.m_backend);
    scale2.m_backend.fpclass = cpp_dec_float_finite;
    scale2.m_backend.prec_elem = 10;
    scale2.m_backend.data._M_elems[0] = 0;
    scale2.m_backend.data._M_elems[1] = 0;
    scale2.m_backend.data._M_elems[2] = 0;
    scale2.m_backend.data._M_elems[3] = 0;
    scale2.m_backend.data._M_elems[4] = 0;
    scale2.m_backend.data._M_elems[5] = 0;
    scale2.m_backend.data._M_elems._24_5_ = 0;
    scale2.m_backend.data._M_elems[7]._1_3_ = 0;
    scale2.m_backend.data._M_elems._32_5_ = 0;
    scale2.m_backend.data._M_elems[9]._1_3_ = 0;
    scale2.m_backend.exp = 0;
    scale2.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&scale2.m_backend,&scale1.m_backend,&z1.m_backend);
    pcVar52 = (cpp_dec_float<50U,_int,_void> *)0x0;
    (*(lp->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x24])(lp,(ulong)local_1000,&scale2.m_backend);
  }
  local_478 = (soplex  [8])local_d18.data._M_elems._0_8_;
  auStack_470[0] = local_d18.data._M_elems[2];
  auStack_470[1] = local_d18.data._M_elems[3];
  local_468[0] = local_d18.data._M_elems[4];
  local_468[1] = local_d18.data._M_elems[5];
  auStack_460[0] = local_d18.data._M_elems[6];
  auStack_460[1] = local_d18.data._M_elems[7];
  local_458[0] = local_d18.data._M_elems[8];
  local_458[1] = local_d18.data._M_elems[9];
  local_450 = local_d18.exp;
  local_44c = local_d18.neg;
  local_448 = local_d18.fpclass;
  iStack_444 = local_d18.prec_elem;
  result_31.m_backend.fpclass = cpp_dec_float_finite;
  result_31.m_backend.prec_elem = 10;
  result_31.m_backend.data._M_elems[0] = 0;
  result_31.m_backend.data._M_elems[1] = 0;
  result_31.m_backend.data._M_elems[2] = 0;
  result_31.m_backend.data._M_elems[3] = 0;
  result_31.m_backend.data._M_elems[4] = 0;
  result_31.m_backend.data._M_elems[5] = 0;
  result_31.m_backend.data._M_elems._24_5_ = 0;
  result_31.m_backend.data._M_elems[7]._1_3_ = 0;
  result_31.m_backend.data._M_elems._32_5_ = 0;
  result_31.m_backend._37_8_ = 0;
  boost::multiprecision::default_ops::
  eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&result_31.m_backend,&local_e58,&local_dd8);
  maxAbs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
            (&scale1,local_478,
             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)&result_31.m_backend,
             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)pcVar52);
  local_4f8 = (soplex  [8])local_d18.data._M_elems._0_8_;
  auStack_4f0[0] = local_d18.data._M_elems[2];
  auStack_4f0[1] = local_d18.data._M_elems[3];
  local_4e8[0] = local_d18.data._M_elems[4];
  local_4e8[1] = local_d18.data._M_elems[5];
  auStack_4e0[0] = local_d18.data._M_elems[6];
  auStack_4e0[1] = local_d18.data._M_elems[7];
  local_4d8[0] = local_d18.data._M_elems[8];
  local_4d8[1] = local_d18.data._M_elems[9];
  local_4d0 = local_d18.exp;
  local_4cc = local_d18.neg;
  local_4c8 = local_d18.fpclass;
  iStack_4c4 = local_d18.prec_elem;
  result_32.m_backend.fpclass = cpp_dec_float_finite;
  result_32.m_backend.prec_elem = 10;
  result_32.m_backend.data._M_elems[0] = 0;
  result_32.m_backend.data._M_elems[1] = 0;
  result_32.m_backend.data._M_elems[2] = 0;
  result_32.m_backend.data._M_elems[3] = 0;
  result_32.m_backend.data._M_elems[4] = 0;
  result_32.m_backend.data._M_elems[5] = 0;
  result_32.m_backend.data._M_elems._24_5_ = 0;
  result_32.m_backend.data._M_elems[7]._1_3_ = 0;
  result_32.m_backend.data._M_elems._32_5_ = 0;
  result_32.m_backend._37_8_ = 0;
  boost::multiprecision::default_ops::
  eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&result_32.m_backend,&local_e58,&local_d98);
  maxAbs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
            (&scale2,local_4f8,
             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)&result_32.m_backend,
             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)pcVar52);
  z1.m_backend.data._M_elems[0] = 0;
  z1.m_backend.data._M_elems[1] = 0x3ff00000;
  tVar47 = boost::multiprecision::operator<(&scale1,(double *)&z1);
  if (tVar47) {
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&scale1,1.0);
  }
  z1.m_backend.data._M_elems[0] = 0;
  z1.m_backend.data._M_elems[1] = 0x3ff00000;
  tVar47 = boost::multiprecision::operator<(&scale2,(double *)&z1);
  if (tVar47) {
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&scale2,1.0);
  }
  z2.m_backend.fpclass = cpp_dec_float_finite;
  z2.m_backend.prec_elem = 10;
  z2.m_backend.data._M_elems[0] = 0;
  z2.m_backend.data._M_elems[1] = 0;
  z2.m_backend.data._M_elems[2] = 0;
  z2.m_backend.data._M_elems[3] = 0;
  z2.m_backend.data._M_elems[4] = 0;
  z2.m_backend.data._M_elems[5] = 0;
  z2.m_backend.data._M_elems._24_5_ = 0;
  z2.m_backend.data._M_elems[7]._1_3_ = 0;
  z2.m_backend.data._M_elems._32_5_ = 0;
  z2.m_backend.data._M_elems[9]._1_3_ = 0;
  z2.m_backend.exp = 0;
  z2.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&z2.m_backend,&local_d18,&scale1.m_backend);
  result_34.m_backend.fpclass = cpp_dec_float_finite;
  result_34.m_backend.prec_elem = 10;
  result_34.m_backend.data._M_elems[0] = 0;
  result_34.m_backend.data._M_elems[1] = 0;
  result_34.m_backend.data._M_elems[2] = 0;
  result_34.m_backend.data._M_elems[3] = 0;
  result_34.m_backend.data._M_elems[4] = 0;
  result_34.m_backend.data._M_elems[5] = 0;
  result_34.m_backend.data._M_elems._24_5_ = 0;
  result_34.m_backend.data._M_elems[7]._1_3_ = 0;
  result_34.m_backend.data._M_elems._32_5_ = 0;
  result_34.m_backend.data._M_elems[9]._1_3_ = 0;
  result_34.m_backend.exp = 0;
  result_34.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&result_34.m_backend,&local_e58,&local_dd8);
  result_35.m_backend.fpclass = cpp_dec_float_finite;
  result_35.m_backend.prec_elem = 10;
  result_35.m_backend.data._M_elems[0] = 0;
  result_35.m_backend.data._M_elems[1] = 0;
  result_35.m_backend.data._M_elems[2] = 0;
  result_35.m_backend.data._M_elems[3] = 0;
  result_35.m_backend.data._M_elems[4] = 0;
  result_35.m_backend.data._M_elems[5] = 0;
  result_35.m_backend.data._M_elems._24_5_ = 0;
  result_35.m_backend.data._M_elems[7]._1_3_ = 0;
  result_35.m_backend.data._M_elems._32_5_ = 0;
  result_35.m_backend.data._M_elems[9]._1_3_ = 0;
  result_35.m_backend.exp = 0;
  result_35.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&result_35.m_backend,&result_34.m_backend,&scale1.m_backend);
  z1.m_backend.fpclass = cpp_dec_float_finite;
  z1.m_backend.prec_elem = 10;
  z1.m_backend.data._M_elems[0] = 0;
  z1.m_backend.data._M_elems[1] = 0;
  z1.m_backend.data._M_elems[2] = 0;
  z1.m_backend.data._M_elems[3] = 0;
  z1.m_backend.data._M_elems[4] = 0;
  z1.m_backend.data._M_elems[5] = 0;
  z1.m_backend.data._M_elems._24_5_ = 0;
  z1.m_backend.data._M_elems[7]._1_3_ = 0;
  z1.m_backend.data._M_elems._32_5_ = 0;
  z1.m_backend.data._M_elems[9]._1_3_ = 0;
  z1.m_backend.exp = 0;
  z1.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&z1.m_backend,&z2.m_backend,&result_35.m_backend);
  result_35.m_backend.fpclass = cpp_dec_float_finite;
  result_35.m_backend.prec_elem = 10;
  result_35.m_backend.data._M_elems[0] = 0;
  result_35.m_backend.data._M_elems[1] = 0;
  result_35.m_backend.data._M_elems[2] = 0;
  result_35.m_backend.data._M_elems[3] = 0;
  result_35.m_backend.data._M_elems[4] = 0;
  result_35.m_backend.data._M_elems[5] = 0;
  result_35.m_backend.data._M_elems._24_5_ = 0;
  result_35.m_backend.data._M_elems[7]._1_3_ = 0;
  result_35.m_backend.data._M_elems._32_5_ = 0;
  result_35.m_backend.data._M_elems[9]._1_3_ = 0;
  result_35.m_backend.exp = 0;
  result_35.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&result_35.m_backend,&local_d18,&scale2.m_backend);
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  boost::multiprecision::default_ops::
  eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            ((cpp_dec_float<50U,_int,_void> *)&ptr,&local_e58,&local_d98);
  result_34.m_backend.fpclass = cpp_dec_float_finite;
  result_34.m_backend.prec_elem = 10;
  result_34.m_backend.data._M_elems[0] = 0;
  result_34.m_backend.data._M_elems[1] = 0;
  result_34.m_backend.data._M_elems[2] = 0;
  result_34.m_backend.data._M_elems[3] = 0;
  result_34.m_backend.data._M_elems[4] = 0;
  result_34.m_backend.data._M_elems[5] = 0;
  result_34.m_backend.data._M_elems._24_5_ = 0;
  result_34.m_backend.data._M_elems[7]._1_3_ = 0;
  result_34.m_backend.data._M_elems._32_5_ = 0;
  result_34.m_backend.data._M_elems[9]._1_3_ = 0;
  result_34.m_backend.exp = 0;
  result_34.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&result_34.m_backend,(cpp_dec_float<50U,_int,_void> *)&ptr,&scale2.m_backend);
  z2.m_backend.fpclass = cpp_dec_float_finite;
  z2.m_backend.prec_elem = 10;
  z2.m_backend.data._M_elems[0] = 0;
  z2.m_backend.data._M_elems[1] = 0;
  z2.m_backend.data._M_elems[2] = 0;
  z2.m_backend.data._M_elems[3] = 0;
  z2.m_backend.data._M_elems[4] = 0;
  z2.m_backend.data._M_elems[5] = 0;
  z2.m_backend.data._M_elems._24_5_ = 0;
  z2.m_backend.data._M_elems[7]._1_3_ = 0;
  z2.m_backend.data._M_elems._32_5_ = 0;
  z2.m_backend.data._M_elems[9]._1_3_ = 0;
  z2.m_backend.exp = 0;
  z2.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&z2.m_backend,&result_35.m_backend,&result_34.m_backend);
  local_578.m_backend.data._M_elems[7]._1_3_ = z1.m_backend.data._M_elems[7]._1_3_;
  local_578.m_backend.data._M_elems._24_5_ = z1.m_backend.data._M_elems._24_5_;
  local_578.m_backend.data._M_elems[0] = z1.m_backend.data._M_elems[0];
  local_578.m_backend.data._M_elems[1] = z1.m_backend.data._M_elems[1];
  local_578.m_backend.data._M_elems[2] = z1.m_backend.data._M_elems[2];
  local_578.m_backend.data._M_elems[3] = z1.m_backend.data._M_elems[3];
  local_578.m_backend.data._M_elems[4] = z1.m_backend.data._M_elems[4];
  local_578.m_backend.data._M_elems[5] = z1.m_backend.data._M_elems[5];
  local_578.m_backend.data._M_elems[9]._1_3_ = z1.m_backend.data._M_elems[9]._1_3_;
  local_578.m_backend.data._M_elems._32_5_ = z1.m_backend.data._M_elems._32_5_;
  local_578.m_backend.exp = z1.m_backend.exp;
  local_578.m_backend.neg = z1.m_backend.neg;
  local_578.m_backend.fpclass = z1.m_backend.fpclass;
  local_578.m_backend.prec_elem = z1.m_backend.prec_elem;
  epsZero(&local_110,this);
  bVar46 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                     (&local_578,&local_110);
  if (bVar46) {
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&z1,0.0);
  }
  local_5b8.m_backend.data._M_elems[9]._1_3_ = z2.m_backend.data._M_elems[9]._1_3_;
  local_5b8.m_backend.data._M_elems._32_5_ = z2.m_backend.data._M_elems._32_5_;
  local_5b8.m_backend.data._M_elems[7]._1_3_ = z2.m_backend.data._M_elems[7]._1_3_;
  local_5b8.m_backend.data._M_elems._24_5_ = z2.m_backend.data._M_elems._24_5_;
  local_5b8.m_backend.data._M_elems[4] = z2.m_backend.data._M_elems[4];
  local_5b8.m_backend.data._M_elems[5] = z2.m_backend.data._M_elems[5];
  local_5b8.m_backend.data._M_elems[0] = z2.m_backend.data._M_elems[0];
  local_5b8.m_backend.data._M_elems[1] = z2.m_backend.data._M_elems[1];
  local_5b8.m_backend.data._M_elems[2] = z2.m_backend.data._M_elems[2];
  local_5b8.m_backend.data._M_elems[3] = z2.m_backend.data._M_elems[3];
  local_5b8.m_backend.exp = z2.m_backend.exp;
  local_5b8.m_backend.neg = z2.m_backend.neg;
  local_5b8.m_backend.fpclass = z2.m_backend.fpclass;
  local_5b8.m_backend.prec_elem = z2.m_backend.prec_elem;
  epsZero(&local_148,this);
  bVar46 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                     (&local_5b8,&local_148);
  if (bVar46) {
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&z2,0.0);
  }
  result_35.m_backend.fpclass = cpp_dec_float_finite;
  result_35.m_backend.prec_elem = 10;
  result_35.m_backend.data._M_elems[0] = 0;
  result_35.m_backend.data._M_elems[1] = 0;
  result_35.m_backend.data._M_elems[2] = 0;
  result_35.m_backend.data._M_elems[3] = 0;
  result_35.m_backend.data._M_elems[4] = 0;
  result_35.m_backend.data._M_elems[5] = 0;
  result_35.m_backend.data._M_elems._24_5_ = 0;
  result_35.m_backend.data._M_elems[7]._1_3_ = 0;
  result_35.m_backend.data._M_elems._32_5_ = 0;
  result_35.m_backend.data._M_elems[9]._1_3_ = 0;
  result_35.m_backend.exp = 0;
  result_35.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&result_35.m_backend,&local_e98,&local_e58);
  result_34.m_backend.data._M_elems[0] = 0;
  result_34.m_backend.data._M_elems[1] = 0;
  tVar47 = boost::multiprecision::operator>
                     ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)&result_35.m_backend,(double *)&result_34);
  if (tVar47) {
    pdVar49 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&result_34.m_backend,*pdVar49,(type *)0x0);
    tVar47 = boost::multiprecision::operator>=
                       ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&local_dd8,
                        (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&result_34.m_backend);
    if (tVar47) {
      pdVar49 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (&result_35.m_backend,-*pdVar49,(type *)0x0);
    }
    else {
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                ((cpp_dec_float<50U,_int,_void> *)&ptr,&z1.m_backend,&scale1.m_backend);
      result_35.m_backend.fpclass = cpp_dec_float_finite;
      result_35.m_backend.prec_elem = 10;
      result_35.m_backend.data._M_elems[0] = 0;
      result_35.m_backend.data._M_elems[1] = 0;
      result_35.m_backend.data._M_elems[2] = 0;
      result_35.m_backend.data._M_elems[3] = 0;
      result_35.m_backend.data._M_elems[4] = 0;
      result_35.m_backend.data._M_elems[5] = 0;
      result_35.m_backend.data._M_elems._24_5_ = 0;
      result_35.m_backend.data._M_elems[7]._1_3_ = 0;
      result_35.m_backend.data._M_elems._32_5_ = 0;
      result_35.m_backend.data._M_elems[9]._1_3_ = 0;
      result_35.m_backend.exp = 0;
      result_35.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&result_35.m_backend,(cpp_dec_float<50U,_int,_void> *)&ptr,&local_e98);
    }
    local_f18.m_backend.data._M_elems._32_5_ = result_35.m_backend.data._M_elems._32_5_;
    local_f18.m_backend.data._M_elems[9]._1_3_ = result_35.m_backend.data._M_elems[9]._1_3_;
    local_f18.m_backend.data._M_elems[4] = result_35.m_backend.data._M_elems[4];
    local_f18.m_backend.data._M_elems[5] = result_35.m_backend.data._M_elems[5];
    local_f18.m_backend.data._M_elems._24_5_ = result_35.m_backend.data._M_elems._24_5_;
    local_f18.m_backend.data._M_elems[7]._1_3_ = result_35.m_backend.data._M_elems[7]._1_3_;
    local_f18.m_backend.data._M_elems[0] = result_35.m_backend.data._M_elems[0];
    local_f18.m_backend.data._M_elems[1] = result_35.m_backend.data._M_elems[1];
    local_f18.m_backend.data._M_elems[2] = result_35.m_backend.data._M_elems[2];
    local_f18.m_backend.data._M_elems[3] = result_35.m_backend.data._M_elems[3];
    local_f18.m_backend.exp = result_35.m_backend.exp;
    local_f18.m_backend.neg = result_35.m_backend.neg;
    local_f18.m_backend.fpclass = result_35.m_backend.fpclass;
    local_f18.m_backend.prec_elem = result_35.m_backend.prec_elem;
    pdVar49 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&result_34.m_backend,-*pdVar49,(type *)0x0);
    tVar47 = boost::multiprecision::operator<=
                       ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&local_d98,
                        (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&result_34.m_backend);
    if (!tVar47) {
      pcVar52 = &z2.m_backend;
      v = &scale2.m_backend;
LAB_002a7639:
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                ((cpp_dec_float<50U,_int,_void> *)&ptr,pcVar52,v);
      result_35.m_backend.fpclass = cpp_dec_float_finite;
      result_35.m_backend.prec_elem = 10;
      result_35.m_backend.data._M_elems[0] = 0;
      result_35.m_backend.data._M_elems[1] = 0;
      result_35.m_backend.data._M_elems[2] = 0;
      result_35.m_backend.data._M_elems[3] = 0;
      result_35.m_backend.data._M_elems[4] = 0;
      result_35.m_backend.data._M_elems[5] = 0;
      result_35.m_backend.data._M_elems._24_5_ = 0;
      result_35.m_backend.data._M_elems[7]._1_3_ = 0;
      result_35.m_backend.data._M_elems._32_5_ = 0;
      result_35.m_backend.data._M_elems[9]._1_3_ = 0;
      result_35.m_backend.exp = 0;
      result_35.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&result_35.m_backend,(cpp_dec_float<50U,_int,_void> *)&ptr,&local_e98);
      goto LAB_002a766b;
    }
  }
  else {
    result_35.m_backend.fpclass = cpp_dec_float_finite;
    result_35.m_backend.prec_elem = 10;
    result_35.m_backend.data._M_elems[0] = 0;
    result_35.m_backend.data._M_elems[1] = 0;
    result_35.m_backend.data._M_elems[2] = 0;
    result_35.m_backend.data._M_elems[3] = 0;
    result_35.m_backend.data._M_elems[4] = 0;
    result_35.m_backend.data._M_elems[5] = 0;
    result_35.m_backend.data._M_elems._24_5_ = 0;
    result_35.m_backend.data._M_elems[7]._1_3_ = 0;
    result_35.m_backend.data._M_elems._32_5_ = 0;
    result_35.m_backend.data._M_elems[9]._1_3_ = 0;
    result_35.m_backend.exp = 0;
    result_35.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&result_35.m_backend,&local_e98,&local_e58);
    result_34.m_backend.data._M_elems[0] = 0;
    result_34.m_backend.data._M_elems[1] = 0;
    tVar47 = boost::multiprecision::operator<
                       ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&result_35.m_backend,(double *)&result_34);
    if (!tVar47) {
      pSVar50 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)&result_35,"XMAISM12 This should never happen.",(allocator *)&result_34);
      SPxInternalCodeException::SPxInternalCodeException(pSVar50,(string *)&result_35);
      __cxa_throw(pSVar50,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    }
    pdVar49 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&result_34.m_backend,-*pdVar49,(type *)0x0);
    tVar47 = boost::multiprecision::operator<=
                       ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&local_d98,
                        (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&result_34.m_backend);
    if (tVar47) {
      pdVar49 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (&result_35.m_backend,-*pdVar49,(type *)0x0);
    }
    else {
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                ((cpp_dec_float<50U,_int,_void> *)&ptr,&z2.m_backend,&scale2.m_backend);
      result_35.m_backend.fpclass = cpp_dec_float_finite;
      result_35.m_backend.prec_elem = 10;
      result_35.m_backend.data._M_elems[0] = 0;
      result_35.m_backend.data._M_elems[1] = 0;
      result_35.m_backend.data._M_elems[2] = 0;
      result_35.m_backend.data._M_elems[3] = 0;
      result_35.m_backend.data._M_elems[4] = 0;
      result_35.m_backend.data._M_elems[5] = 0;
      result_35.m_backend.data._M_elems._24_5_ = 0;
      result_35.m_backend.data._M_elems[7]._1_3_ = 0;
      result_35.m_backend.data._M_elems._32_5_ = 0;
      result_35.m_backend.data._M_elems[9]._1_3_ = 0;
      result_35.m_backend.exp = 0;
      result_35.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&result_35.m_backend,(cpp_dec_float<50U,_int,_void> *)&ptr,&local_e98);
    }
    local_f18.m_backend.data._M_elems._32_5_ = result_35.m_backend.data._M_elems._32_5_;
    local_f18.m_backend.data._M_elems[9]._1_3_ = result_35.m_backend.data._M_elems[9]._1_3_;
    local_f18.m_backend.data._M_elems[4] = result_35.m_backend.data._M_elems[4];
    local_f18.m_backend.data._M_elems[5] = result_35.m_backend.data._M_elems[5];
    local_f18.m_backend.data._M_elems._24_5_ = result_35.m_backend.data._M_elems._24_5_;
    local_f18.m_backend.data._M_elems[7]._1_3_ = result_35.m_backend.data._M_elems[7]._1_3_;
    local_f18.m_backend.data._M_elems[0] = result_35.m_backend.data._M_elems[0];
    local_f18.m_backend.data._M_elems[1] = result_35.m_backend.data._M_elems[1];
    local_f18.m_backend.data._M_elems[2] = result_35.m_backend.data._M_elems[2];
    local_f18.m_backend.data._M_elems[3] = result_35.m_backend.data._M_elems[3];
    local_f18.m_backend.exp = result_35.m_backend.exp;
    local_f18.m_backend.neg = result_35.m_backend.neg;
    local_f18.m_backend.fpclass = result_35.m_backend.fpclass;
    local_f18.m_backend.prec_elem = result_35.m_backend.prec_elem;
    pdVar49 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&result_34.m_backend,*pdVar49,(type *)0x0);
    tVar47 = boost::multiprecision::operator>=
                       ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&local_dd8,
                        (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&result_34.m_backend);
    if (!tVar47) {
      pcVar52 = &z1.m_backend;
      v = &scale1.m_backend;
      goto LAB_002a7639;
    }
  }
  pdVar49 = (double *)infinity();
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (&result_35.m_backend,*pdVar49,(type *)0x0);
LAB_002a766b:
  iVar9 = local_ed8.exp;
  bVar46 = local_fa8.neg;
  iVar6 = local_fa8.exp;
  local_f58.m_backend.data._M_elems._32_5_ = result_35.m_backend.data._M_elems._32_5_;
  local_f58.m_backend.data._M_elems[9]._1_3_ = result_35.m_backend.data._M_elems[9]._1_3_;
  local_f58.m_backend.data._M_elems[4] = result_35.m_backend.data._M_elems[4];
  local_f58.m_backend.data._M_elems[5] = result_35.m_backend.data._M_elems[5];
  local_f58.m_backend.data._M_elems._24_5_ = result_35.m_backend.data._M_elems._24_5_;
  local_f58.m_backend.data._M_elems[7]._1_3_ = result_35.m_backend.data._M_elems[7]._1_3_;
  local_f58.m_backend.data._M_elems[0] = result_35.m_backend.data._M_elems[0];
  local_f58.m_backend.data._M_elems[1] = result_35.m_backend.data._M_elems[1];
  local_f58.m_backend.data._M_elems[2] = result_35.m_backend.data._M_elems[2];
  local_f58.m_backend.data._M_elems[3] = result_35.m_backend.data._M_elems[3];
  local_f58.m_backend.exp = result_35.m_backend.exp;
  local_f58.m_backend.neg = result_35.m_backend.neg;
  local_f58.m_backend.fpclass = result_35.m_backend.fpclass;
  local_f58.m_backend.prec_elem = result_35.m_backend.prec_elem;
  result_35.m_backend.data._M_elems._32_5_ = local_ed8.data._M_elems._32_5_;
  result_35.m_backend.data._M_elems[9]._1_3_ = local_ed8.data._M_elems[9]._1_3_;
  result_35.m_backend.data._M_elems[4] = local_ed8.data._M_elems[4];
  result_35.m_backend.data._M_elems[5] = local_ed8.data._M_elems[5];
  result_35.m_backend.data._M_elems._24_5_ = local_ed8.data._M_elems._24_5_;
  result_35.m_backend.data._M_elems[7]._1_3_ = local_ed8.data._M_elems[7]._1_3_;
  result_35.m_backend.data._M_elems[0] = local_ed8.data._M_elems[0];
  result_35.m_backend.data._M_elems[1] = local_ed8.data._M_elems[1];
  result_35.m_backend.data._M_elems[2] = local_ed8.data._M_elems[2];
  result_35.m_backend.data._M_elems[3] = local_ed8.data._M_elems[3];
  iVar8 = local_ed8.prec_elem;
  result_34.m_backend.data._M_elems._32_5_ = local_fa8.data._M_elems._32_5_;
  result_34.m_backend.data._M_elems[9]._1_3_ = local_fa8.data._M_elems[9]._1_3_;
  result_34.m_backend.data._M_elems[4] = local_fa8.data._M_elems[4];
  result_34.m_backend.data._M_elems[5] = local_fa8.data._M_elems[5];
  result_34.m_backend.data._M_elems._24_5_ = local_fa8.data._M_elems._24_5_;
  result_34.m_backend.data._M_elems[7]._1_3_ = local_fa8.data._M_elems[7]._1_3_;
  result_34.m_backend.data._M_elems[0] = local_fa8.data._M_elems[0];
  result_34.m_backend.data._M_elems[1] = local_fa8.data._M_elems[1];
  result_34.m_backend.data._M_elems[2] = local_fa8.data._M_elems[2];
  result_34.m_backend.data._M_elems[3] = local_fa8.data._M_elems[3];
  local_cd8._0_4_ = local_fa8.fpclass;
  local_cd8._4_4_ = local_fa8.prec_elem;
  uStack_cd0 = 0;
  local_5f8.m_backend.data._M_elems[9]._1_3_ = local_f18.m_backend.data._M_elems[9]._1_3_;
  local_5f8.m_backend.data._M_elems._32_5_ = local_f18.m_backend.data._M_elems._32_5_;
  local_5f8.m_backend.data._M_elems[7]._1_3_ = local_f18.m_backend.data._M_elems[7]._1_3_;
  local_5f8.m_backend.data._M_elems._24_5_ = local_f18.m_backend.data._M_elems._24_5_;
  local_5f8.m_backend.data._M_elems[4] = local_f18.m_backend.data._M_elems[4];
  local_5f8.m_backend.data._M_elems[5] = local_f18.m_backend.data._M_elems[5];
  local_5f8.m_backend.data._M_elems[0] = local_f18.m_backend.data._M_elems[0];
  local_5f8.m_backend.data._M_elems[1] = local_f18.m_backend.data._M_elems[1];
  local_5f8.m_backend.data._M_elems[2] = local_f18.m_backend.data._M_elems[2];
  local_5f8.m_backend.data._M_elems[3] = local_f18.m_backend.data._M_elems[3];
  local_5f8.m_backend.exp = local_f18.m_backend.exp;
  local_5f8.m_backend.neg = local_f18.m_backend.neg;
  local_5f8.m_backend.fpclass = local_f18.m_backend.fpclass;
  local_5f8.m_backend.prec_elem = local_f18.m_backend.prec_elem;
  local_638.m_backend.data._M_elems[8] = local_ed8.data._M_elems[8];
  local_638.m_backend.data._M_elems[9] = local_ed8.data._M_elems[9];
  local_638.m_backend.data._M_elems[4] = local_ed8.data._M_elems[4];
  local_638.m_backend.data._M_elems[5] = local_ed8.data._M_elems[5];
  local_638.m_backend.data._M_elems[6] = local_ed8.data._M_elems[6];
  local_638.m_backend.data._M_elems[7] = local_ed8.data._M_elems[7];
  local_638.m_backend.data._M_elems[0] = local_ed8.data._M_elems[0];
  local_638.m_backend.data._M_elems[1] = local_ed8.data._M_elems[1];
  local_638.m_backend.data._M_elems[2] = local_ed8.data._M_elems[2];
  local_638.m_backend.data._M_elems[3] = local_ed8.data._M_elems[3];
  local_638.m_backend.exp = local_ed8.exp;
  local_f60 = (Item *)CONCAT71(local_f60._1_7_,local_ed8.neg);
  local_638.m_backend.neg = local_ed8.neg;
  local_f68 = (Item *)CONCAT44(local_f68._4_4_,local_ed8.fpclass);
  local_638.m_backend.fpclass = local_ed8.fpclass;
  local_638.m_backend.prec_elem = local_ed8.prec_elem;
  epsZero(&local_180,this);
  bVar45 = GT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                     (&local_5f8,&local_638,&local_180);
  if (bVar45) {
    (*(lp->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x2a])(lp,(ulong)local_1000,&local_f18,0);
    piVar1 = &(this->
              super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).m_chgBnds;
    *piVar1 = *piVar1 + 1;
  }
  local_678.m_backend.data._M_elems[9]._1_3_ = local_f58.m_backend.data._M_elems[9]._1_3_;
  local_678.m_backend.data._M_elems._32_5_ = local_f58.m_backend.data._M_elems._32_5_;
  local_678.m_backend.data._M_elems[7]._1_3_ = local_f58.m_backend.data._M_elems[7]._1_3_;
  local_678.m_backend.data._M_elems._24_5_ = local_f58.m_backend.data._M_elems._24_5_;
  local_678.m_backend.data._M_elems[4] = local_f58.m_backend.data._M_elems[4];
  local_678.m_backend.data._M_elems[5] = local_f58.m_backend.data._M_elems[5];
  local_678.m_backend.data._M_elems[0] = local_f58.m_backend.data._M_elems[0];
  local_678.m_backend.data._M_elems[1] = local_f58.m_backend.data._M_elems[1];
  local_678.m_backend.data._M_elems[2] = local_f58.m_backend.data._M_elems[2];
  local_678.m_backend.data._M_elems[3] = local_f58.m_backend.data._M_elems[3];
  local_678.m_backend.exp = local_f58.m_backend.exp;
  local_678.m_backend.neg = local_f58.m_backend.neg;
  local_678.m_backend.fpclass = local_f58.m_backend.fpclass;
  local_678.m_backend.prec_elem = local_f58.m_backend.prec_elem;
  local_6b8.m_backend.data._M_elems[0] = local_fa8.data._M_elems[0];
  local_6b8.m_backend.data._M_elems[1] = local_fa8.data._M_elems[1];
  local_6b8.m_backend.data._M_elems[2] = local_fa8.data._M_elems[2];
  local_6b8.m_backend.data._M_elems[3] = local_fa8.data._M_elems[3];
  local_6b8.m_backend.data._M_elems[4] = local_fa8.data._M_elems[4];
  local_6b8.m_backend.data._M_elems[5] = local_fa8.data._M_elems[5];
  local_6b8.m_backend.data._M_elems[6] = local_fa8.data._M_elems[6];
  local_6b8.m_backend.data._M_elems[7] = local_fa8.data._M_elems[7];
  local_6b8.m_backend.data._M_elems[8] = local_fa8.data._M_elems[8];
  local_6b8.m_backend.data._M_elems[9] = local_fa8.data._M_elems[9];
  local_6b8.m_backend.exp = local_fa8.exp;
  local_6b8.m_backend.neg = local_fa8.neg;
  local_6b8.m_backend.fpclass = local_fa8.fpclass;
  local_6b8.m_backend.prec_elem = local_fa8.prec_elem;
  epsZero(&local_1b8,this);
  bVar45 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                     (&local_678,&local_6b8,&local_1b8);
  if (bVar45) {
    (*(lp->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x2d])(lp,(ulong)local_1000,&local_f58,0);
    piVar1 = &(this->
              super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).m_chgBnds;
    *piVar1 = *piVar1 + 1;
  }
  this_00 = (AggregationPS *)operator_new(0x1c8);
  iVar11 = *i;
  local_6f8.m_backend.data._M_elems[0] = local_d18.data._M_elems[0];
  local_6f8.m_backend.data._M_elems[1] = local_d18.data._M_elems[1];
  local_6f8.m_backend.data._M_elems[2] = local_d18.data._M_elems[2];
  local_6f8.m_backend.data._M_elems[3] = local_d18.data._M_elems[3];
  local_6f8.m_backend.data._M_elems[4] = local_d18.data._M_elems[4];
  local_6f8.m_backend.data._M_elems[5] = local_d18.data._M_elems[5];
  local_6f8.m_backend.data._M_elems[6] = local_d18.data._M_elems[6];
  local_6f8.m_backend.data._M_elems[7] = local_d18.data._M_elems[7];
  local_6f8.m_backend.data._M_elems[8] = local_d18.data._M_elems[8];
  local_6f8.m_backend.data._M_elems[9] = local_d18.data._M_elems[9];
  local_6f8.m_backend.exp = local_d18.exp;
  local_6f8.m_backend.neg = local_d18.neg;
  local_6f8.m_backend.fpclass = local_d18.fpclass;
  local_6f8.m_backend.prec_elem = local_d18.prec_elem;
  local_738.m_backend.data._M_elems[9]._1_3_ = result_34.m_backend.data._M_elems[9]._1_3_;
  local_738.m_backend.data._M_elems._32_5_ = result_34.m_backend.data._M_elems._32_5_;
  local_738.m_backend.data._M_elems[7]._1_3_ = result_34.m_backend.data._M_elems[7]._1_3_;
  local_738.m_backend.data._M_elems._24_5_ = result_34.m_backend.data._M_elems._24_5_;
  local_738.m_backend.data._M_elems[4] = result_34.m_backend.data._M_elems[4];
  local_738.m_backend.data._M_elems[5] = result_34.m_backend.data._M_elems[5];
  local_738.m_backend.data._M_elems[0] = result_34.m_backend.data._M_elems[0];
  local_738.m_backend.data._M_elems[1] = result_34.m_backend.data._M_elems[1];
  local_738.m_backend.data._M_elems[2] = result_34.m_backend.data._M_elems[2];
  local_738.m_backend.data._M_elems[3] = result_34.m_backend.data._M_elems[3];
  local_738.m_backend.exp = iVar6;
  local_738.m_backend.neg = bVar46;
  local_738.m_backend.fpclass = (undefined4)local_cd8;
  local_738.m_backend.prec_elem = local_cd8._4_4_;
  local_778.m_backend.data._M_elems[7]._1_3_ = result_35.m_backend.data._M_elems[7]._1_3_;
  local_778.m_backend.data._M_elems._24_5_ = result_35.m_backend.data._M_elems._24_5_;
  local_778.m_backend.data._M_elems[0] = result_35.m_backend.data._M_elems[0];
  local_778.m_backend.data._M_elems[1] = result_35.m_backend.data._M_elems[1];
  local_778.m_backend.data._M_elems[2] = result_35.m_backend.data._M_elems[2];
  local_778.m_backend.data._M_elems[3] = result_35.m_backend.data._M_elems[3];
  local_778.m_backend.data._M_elems[4] = result_35.m_backend.data._M_elems[4];
  local_778.m_backend.data._M_elems[5] = result_35.m_backend.data._M_elems[5];
  local_778.m_backend.data._M_elems[9]._1_3_ = result_35.m_backend.data._M_elems[9]._1_3_;
  local_778.m_backend.data._M_elems._32_5_ = result_35.m_backend.data._M_elems._32_5_;
  local_778.m_backend.exp = iVar9;
  local_778.m_backend.neg = (bool)local_f60._0_1_;
  local_778.m_backend.fpclass = (fpclass_type)local_f68;
  local_778.m_backend.prec_elem = iVar8;
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_ac8,
             &(this->
              super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
  AggregationPS::AggregationPS
            (this_00,lp,iVar11,local_1004,&local_6f8,&local_738,&local_778,
             (shared_ptr<soplex::Tolerances> *)&local_ac8);
  std::
  __shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep,(__gnu_cxx::_Lock_policy)2>
  ::
  __shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::AggregationPS,void>
            ((__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep,(__gnu_cxx::_Lock_policy)2>
              *)&ptr,this_00);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_ac8._M_refcount);
  std::
  vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
  ::push_back(&(this->m_hist).data,&ptr);
  removeRow(this,lp,*i);
  removeCol(this,lp,local_1004);
  uVar4 = (this->
          super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).m_remRows;
  uVar5 = (this->
          super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).m_remCols;
  (this->
  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).m_remRows = uVar4 + 1;
  (this->
  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).m_remCols = uVar5 + 1;
  piVar1 = &(this->
            super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).m_remNzos;
  *piVar1 = *piVar1 + 2;
  piVar1 = (this->m_stat).data + 0xf;
  *piVar1 = *piVar1 + 1;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ptr.
              super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return OKAY;
}

Assistant:

typename SPxSimplifier<R>::Result SPxMainSM<R>::aggregateVars(SPxLPBase<R>& lp,
      const SVectorBase<R>& row, int& i)
{
   assert(row.size() == 2);
   assert(EQrel(lp.lhs(i), lp.rhs(i), feastol()));

   R rhs = lp.rhs(i);
   assert(rhs < R(infinity) && rhs > R(-infinity));

   int j = row.index(0);
   int k = row.index(1);
   R aij = row.value(0);
   R aik = row.value(1);
   R lower_j = lp.lower(j);
   R upper_j = lp.upper(j);
   R lower_k = lp.lower(k);
   R upper_k = lp.upper(k);

   // fixed variables should be removed by simplifyCols()
   if(EQrel(lower_j, upper_j, feastol()) || EQrel(lower_k, upper_k, feastol()))
      return this->OKAY;

   assert(isNotZero(aij, this->epsZero()) && isNotZero(aik, this->epsZero()));

   SPxOut::debug(this, "IMAISM23 row {}: doubleton equation -> {} x_{} + {} x_{} = {}", i, aij, j, aik,
                 k, rhs);

   // determine which variable can be aggregated without requiring bound tightening of the other variable
   R new_lo_j;
   R new_up_j;
   R new_lo_k;
   R new_up_k;

   if(aij * aik < 0.0)
   {
      // orientation persists
      new_lo_j = (upper_k >=  R(infinity)) ? R(-infinity) : (rhs - aik * upper_k) / aij;
      new_up_j = (lower_k <= R(-infinity)) ?  R(infinity) : (rhs - aik * lower_k) / aij;
      new_lo_k = (upper_j >=  R(infinity)) ? R(-infinity) : (rhs - aij * upper_j) / aik;
      new_up_k = (lower_j <= R(-infinity)) ?  R(infinity) : (rhs - aij * lower_j) / aik;
   }
   else if(aij * aik > 0.0)
   {
      // orientation is reversed
      new_lo_j = (lower_k <= R(-infinity)) ? R(-infinity) : (rhs - aik * lower_k) / aij;
      new_up_j = (upper_k >=  R(infinity)) ?  R(infinity) : (rhs - aik * upper_k) / aij;
      new_lo_k = (lower_j <= R(-infinity)) ? R(-infinity) : (rhs - aij * lower_j) / aik;
      new_up_k = (upper_j >=  R(infinity)) ?  R(infinity) : (rhs - aij * upper_j) / aik;
   }
   else
      throw SPxInternalCodeException("XMAISM12 This should never happen.");

   bool flip_jk = false;

   if(new_lo_j <= R(-infinity) && new_up_j >= R(infinity))
   {
      // no bound tightening on x_j when x_k is aggregated
      flip_jk = true;
   }
   else if(new_lo_k <= R(-infinity) && new_up_k >= R(infinity))
   {
      // no bound tightening on x_k when x_j is aggregated
      flip_jk = false;
   }
   else if(LE(new_lo_j, lower_j, this->tolerances()->epsilon())
           && GE(new_up_j, upper_j, this->tolerances()->epsilon()))
   {
      if(LE(new_lo_k, lower_k, this->tolerances()->epsilon())
            && GE(new_up_k, upper_k, this->tolerances()->epsilon()))
      {
         // both variables' bounds are not affected by aggregation; choose the better aggregation coeff (aik/aij)
         if(spxAbs(aij) > spxAbs(aik))
            flip_jk = false;
         else
            flip_jk = true;
      }
      else
         flip_jk = false;
   }
   else if(LE(new_lo_k, lower_k, this->tolerances()->epsilon())
           && GE(new_up_k, upper_k, this->tolerances()->epsilon()))
   {
      flip_jk = true;
   }
   else
   {
      if(spxAbs(aij) > spxAbs(aik))
         flip_jk = false;
      else
         flip_jk = true;
   }

   if(flip_jk)
   {
      int _j = j;
      R _aij = aij;
      R _lower_j = lower_j;
      R _upper_j = upper_j;
      j = k;
      k = _j;
      aij = aik;
      aik = _aij;
      lower_j = lower_k;
      lower_k = _lower_j;
      upper_j = upper_k;
      upper_k = _upper_j;
   }

   const SVectorBase<R>& col_j = lp.colVector(j);
   const SVectorBase<R>& col_k = lp.colVector(k);

   // aggregation coefficients (x_j = aggr_coef * x_k + aggr_const)
   R aggr_coef = - (aik / aij);
   R aggr_const = rhs / aij;

   SPxOut::debug(this, " removed, replacing x_{} with {} + {} * x_{}\n", j, aggr_const, aggr_coef, k);

   // replace all occurrences of x_j
   for(int r = 0; r < col_j.size(); ++r)
   {
      int row_r = col_j.index(r);
      R arj = col_j.value(r);

      // skip row i
      if(row_r == i)
         continue;

      // adapt sides of row r
      R lhs_r = lp.lhs(row_r);
      R rhs_r = lp.rhs(row_r);

      if(lhs_r > R(-infinity))
      {
         lp.changeLhs(row_r, lhs_r - aggr_const * arj);
         this->m_chgLRhs++;
      }

      if(rhs_r < R(infinity))
      {
         lp.changeRhs(row_r, rhs_r - aggr_const * arj);
         this->m_chgLRhs++;
      }

      R newcoef = aggr_coef * arj;
      int pos_rk = col_k.pos(row_r);

      // check whether x_k is also present in row r and get its coefficient
      if(pos_rk >= 0)
      {
         R ark = col_k.value(pos_rk);
         newcoef += ark;
         this->m_remNzos++;
      }

      // add new column k to row r or adapt the coefficient a_rk
      lp.changeElement(row_r, k, newcoef);
   }

   // adapt objective function
   R obj_j = lp.obj(j);

   if(isNotZero(obj_j, this->epsZero()))
   {
      this->addObjoffset(aggr_const * obj_j);
      R obj_k = lp.obj(k);
      lp.changeObj(k, obj_k + aggr_coef * obj_j);
   }

   // adapt bounds of x_k
   R scale1 = maxAbs(rhs, aij * upper_j);
   R scale2 = maxAbs(rhs, aij * lower_j);

   if(scale1 < 1.0)
      scale1 = 1.0;

   if(scale2 < 1.0)
      scale2 = 1.0;

   R z1 = (rhs / scale1) - (aij * upper_j / scale1);
   R z2 = (rhs / scale2) - (aij * lower_j / scale2);

   // just some rounding
   if(isZero(z1, this->epsZero()))
      z1 = 0.0;

   if(isZero(z2, this->epsZero()))
      z2 = 0.0;

   // determine which side has to be used for the bounds comparison below
   if(aik * aij > 0.0)
   {
      new_lo_k = (upper_j >=  R(infinity)) ? R(-infinity) : z1 * scale1 / aik;
      new_up_k = (lower_j <= R(-infinity)) ?  R(infinity) : z2 * scale2 / aik;
   }
   else if(aik * aij < 0.0)
   {
      new_lo_k = (lower_j <= R(-infinity)) ? R(-infinity) : z2 * scale2 / aik;
      new_up_k = (upper_j >=  R(infinity)) ?  R(infinity) : z1 * scale1 / aik;
   }
   else
      throw SPxInternalCodeException("XMAISM12 This should never happen.");

   // change bounds of x_k if the new ones are tighter
   R oldlower_k = lower_k;
   R oldupper_k = upper_k;

   if(GT(new_lo_k, lower_k, this->epsZero()))
   {
      lp.changeLower(k, new_lo_k);
      this->m_chgBnds++;
   }

   if(LT(new_up_k, upper_k, this->epsZero()))
   {
      lp.changeUpper(k, new_up_k);
      this->m_chgBnds++;
   }

   std::shared_ptr<PostStep> ptr(new AggregationPS(lp, i, j, rhs, oldupper_k, oldlower_k,
                                 this->_tolerances));
   m_hist.append(ptr);

   removeRow(lp, i);
   removeCol(lp, j);

   this->m_remRows++;
   this->m_remCols++;
   this->m_remNzos += 2;

   ++m_stat[AGGREGATION];

   return this->OKAY;
}